

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx512::ConeCurveMiIntersectorK<8,_16,_true>::intersect
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  ulong uVar74;
  ulong uVar75;
  byte bVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  byte bVar91;
  byte bVar92;
  uint uVar93;
  uint uVar94;
  undefined1 auVar95 [8];
  uint uVar96;
  byte bVar97;
  uint uVar98;
  ulong uVar99;
  byte bVar100;
  ulong uVar101;
  ulong uVar102;
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar170;
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined4 uVar183;
  undefined1 auVar184 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  uint local_780 [4];
  uint uStack_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  uint local_700 [4];
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0 [4];
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [64];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  int iVar103;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  undefined1 auVar185 [64];
  
  pSVar9 = context->scene;
  pGVar10 = (pSVar9->geometries).items[line->sharedGeomID].ptr;
  uVar98 = (line->v0).field_0.i[0];
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar94 = (line->v0).field_0.i[1];
  uVar93 = (line->v0).field_0.i[2];
  uVar96 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[4];
  auVar118._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar118._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar98 * (long)p_Var12);
  uVar6 = (line->v0).field_0.i[5];
  auVar136._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar136._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar94 * (long)p_Var12);
  uVar7 = (line->v0).field_0.i[6];
  auVar114._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar114._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar93 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[7];
  auVar115._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar115._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar96 * (long)p_Var12);
  auVar104 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar129._0_16_ =
       ZEXT116(0) * auVar104 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar98 + 1) * (long)p_Var12);
  auVar129._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
  auVar104 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar158._0_16_ =
       ZEXT116(0) * auVar104 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar94 + 1) * (long)p_Var12);
  auVar158._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
  auVar104 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar160._0_16_ =
       ZEXT116(0) * auVar104 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar93 + 1) * (long)p_Var12);
  auVar160._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
  auVar104 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar162._0_16_ =
       ZEXT116(0) * auVar104 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar96 + 1) * (long)p_Var12);
  auVar162._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
  local_360 = vpbroadcastd_avx512vl();
  auVar110 = vunpcklps_avx(auVar118,auVar114);
  auVar108 = vunpckhps_avx(auVar118,auVar114);
  auVar118 = vunpcklps_avx(auVar136,auVar115);
  auVar109 = vunpckhps_avx(auVar136,auVar115);
  auVar114 = vunpcklps_avx(auVar110,auVar118);
  auVar118 = vunpckhps_avx(auVar110,auVar118);
  auVar115 = vunpcklps_avx(auVar108,auVar109);
  auVar136 = vunpckhps_avx(auVar108,auVar109);
  auVar110 = vpunpckldq_avx2(auVar129,auVar160);
  auVar108 = vpunpckhdq_avx2(auVar129,auVar160);
  auVar129 = vpunpckldq_avx2(auVar158,auVar162);
  auVar109 = vpunpckhdq_avx2(auVar158,auVar162);
  auVar160 = vpunpckldq_avx2(auVar110,auVar129);
  auVar129 = vpunpckhdq_avx2(auVar110,auVar129);
  auVar162 = vpunpckldq_avx2(auVar108,auVar109);
  auVar158 = vpunpckhdq_avx2(auVar108,auVar109);
  auVar108 = vpcmpeqd_avx2(auVar110,auVar110);
  uVar75 = vpcmpd_avx512vl(auVar108,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar112._4_4_ = fVar1;
  auVar112._0_4_ = fVar1;
  auVar112._8_4_ = fVar1;
  auVar112._12_4_ = fVar1;
  auVar112._16_4_ = fVar1;
  auVar112._20_4_ = fVar1;
  auVar112._24_4_ = fVar1;
  auVar112._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar113._4_4_ = fVar2;
  auVar113._0_4_ = fVar2;
  auVar113._8_4_ = fVar2;
  auVar113._12_4_ = fVar2;
  auVar113._16_4_ = fVar2;
  auVar113._20_4_ = fVar2;
  auVar113._24_4_ = fVar2;
  auVar113._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  auVar116._4_4_ = fVar3;
  auVar116._0_4_ = fVar3;
  auVar116._8_4_ = fVar3;
  auVar116._12_4_ = fVar3;
  auVar116._16_4_ = fVar3;
  auVar116._20_4_ = fVar3;
  auVar116._24_4_ = fVar3;
  auVar116._28_4_ = fVar3;
  auVar105 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar194 = ZEXT3264(auVar105);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar195 = ZEXT3264(auVar106);
  auVar107 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar196 = ZEXT3264(auVar107);
  auVar104 = vmulss_avx512f(auVar107._0_16_,auVar107._0_16_);
  auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar106,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
  auVar110._0_4_ = auVar108._0_4_;
  auVar110._4_4_ = auVar110._0_4_;
  auVar110._8_4_ = auVar110._0_4_;
  auVar110._12_4_ = auVar110._0_4_;
  auVar110._16_4_ = auVar110._0_4_;
  auVar110._20_4_ = auVar110._0_4_;
  auVar110._24_4_ = auVar110._0_4_;
  auVar110._28_4_ = auVar110._0_4_;
  auVar109 = vrcp14ps_avx512vl(auVar110);
  auVar108._8_4_ = 0x3f800000;
  auVar108._0_8_ = 0x3f8000003f800000;
  auVar108._12_4_ = 0x3f800000;
  auVar108._16_4_ = 0x3f800000;
  auVar108._20_4_ = 0x3f800000;
  auVar108._24_4_ = 0x3f800000;
  auVar108._28_4_ = 0x3f800000;
  auVar108 = vfnmadd213ps_avx512vl(auVar110,auVar109,auVar108);
  auVar104 = vfmadd132ps_fma(auVar108,auVar109,auVar109);
  auVar111._0_4_ = auVar114._0_4_ + auVar160._0_4_;
  auVar111._4_4_ = auVar114._4_4_ + auVar160._4_4_;
  auVar111._8_4_ = auVar114._8_4_ + auVar160._8_4_;
  auVar111._12_4_ = auVar114._12_4_ + auVar160._12_4_;
  auVar111._16_4_ = auVar114._16_4_ + auVar160._16_4_;
  auVar111._20_4_ = auVar114._20_4_ + auVar160._20_4_;
  auVar111._24_4_ = auVar114._24_4_ + auVar160._24_4_;
  auVar111._28_4_ = auVar114._28_4_ + auVar160._28_4_;
  auVar117._0_4_ = auVar129._0_4_ + auVar118._0_4_;
  auVar117._4_4_ = auVar129._4_4_ + auVar118._4_4_;
  auVar117._8_4_ = auVar129._8_4_ + auVar118._8_4_;
  auVar117._12_4_ = auVar129._12_4_ + auVar118._12_4_;
  auVar117._16_4_ = auVar129._16_4_ + auVar118._16_4_;
  auVar117._20_4_ = auVar129._20_4_ + auVar118._20_4_;
  auVar117._24_4_ = auVar129._24_4_ + auVar118._24_4_;
  auVar117._28_4_ = auVar129._28_4_ + auVar118._28_4_;
  auVar119._0_4_ = auVar115._0_4_ + auVar162._0_4_;
  auVar119._4_4_ = auVar115._4_4_ + auVar162._4_4_;
  auVar119._8_4_ = auVar115._8_4_ + auVar162._8_4_;
  auVar119._12_4_ = auVar115._12_4_ + auVar162._12_4_;
  auVar119._16_4_ = auVar115._16_4_ + auVar162._16_4_;
  auVar119._20_4_ = auVar115._20_4_ + auVar162._20_4_;
  auVar119._24_4_ = auVar115._24_4_ + auVar162._24_4_;
  auVar119._28_4_ = auVar115._28_4_ + auVar162._28_4_;
  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar109 = vmulps_avx512vl(auVar111,auVar108);
  auVar110 = vmulps_avx512vl(auVar117,auVar108);
  auVar111 = vmulps_avx512vl(auVar119,auVar108);
  auVar108 = vsubps_avx(auVar109,auVar112);
  auVar109 = vsubps_avx(auVar110,auVar113);
  auVar110 = vsubps_avx(auVar111,auVar116);
  auVar110 = vmulps_avx512vl(auVar110,auVar107);
  auVar109 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar109);
  auVar108 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar108);
  auVar147._0_4_ = auVar108._0_4_ * auVar104._0_4_;
  auVar147._4_4_ = auVar108._4_4_ * auVar104._4_4_;
  auVar147._8_4_ = auVar108._8_4_ * auVar104._8_4_;
  auVar147._12_4_ = auVar108._12_4_ * auVar104._12_4_;
  auVar147._16_4_ = auVar108._16_4_ * 0.0;
  auVar147._20_4_ = auVar108._20_4_ * 0.0;
  auVar147._24_4_ = auVar108._24_4_ * 0.0;
  auVar147._28_4_ = 0;
  auVar108 = vmulps_avx512vl(auVar105,auVar147);
  auVar109 = vmulps_avx512vl(auVar106,auVar147);
  auVar110 = vmulps_avx512vl(auVar107,auVar147);
  auVar123._0_4_ = auVar108._0_4_ + fVar1;
  auVar123._4_4_ = auVar108._4_4_ + fVar1;
  auVar123._8_4_ = auVar108._8_4_ + fVar1;
  auVar123._12_4_ = auVar108._12_4_ + fVar1;
  auVar123._16_4_ = auVar108._16_4_ + fVar1;
  auVar123._20_4_ = auVar108._20_4_ + fVar1;
  auVar123._24_4_ = auVar108._24_4_ + fVar1;
  auVar123._28_4_ = auVar108._28_4_ + fVar1;
  auVar124._0_4_ = auVar109._0_4_ + fVar2;
  auVar124._4_4_ = auVar109._4_4_ + fVar2;
  auVar124._8_4_ = auVar109._8_4_ + fVar2;
  auVar124._12_4_ = auVar109._12_4_ + fVar2;
  auVar124._16_4_ = auVar109._16_4_ + fVar2;
  auVar124._20_4_ = auVar109._20_4_ + fVar2;
  auVar124._24_4_ = auVar109._24_4_ + fVar2;
  auVar124._28_4_ = auVar109._28_4_ + fVar2;
  auVar125._0_4_ = fVar3 + auVar110._0_4_;
  auVar125._4_4_ = fVar3 + auVar110._4_4_;
  auVar125._8_4_ = fVar3 + auVar110._8_4_;
  auVar125._12_4_ = fVar3 + auVar110._12_4_;
  auVar125._16_4_ = fVar3 + auVar110._16_4_;
  auVar125._20_4_ = fVar3 + auVar110._20_4_;
  auVar125._24_4_ = fVar3 + auVar110._24_4_;
  auVar125._28_4_ = fVar3 + auVar110._28_4_;
  auVar111 = vsubps_avx512vl(auVar160,auVar114);
  auVar197 = ZEXT3264(auVar111);
  auVar112 = vsubps_avx512vl(auVar129,auVar118);
  auVar198 = ZEXT3264(auVar112);
  auVar113 = vsubps_avx512vl(auVar162,auVar115);
  auVar199 = ZEXT3264(auVar113);
  _local_7e0 = vsubps_avx(auVar123,auVar114);
  auVar114 = vsubps_avx512vl(auVar124,auVar118);
  auVar201 = ZEXT3264(auVar114);
  _local_660 = vsubps_avx512vl(auVar125,auVar115);
  auVar108 = vmulps_avx512vl(auVar113,auVar113);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar112);
  auVar115 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar111);
  auVar108 = vmulps_avx512vl(auVar113,_local_660);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,auVar112);
  auVar116 = vfmadd231ps_avx512vl(auVar108,_local_7e0,auVar111);
  auVar108 = vmulps_avx512vl(auVar113,auVar107);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar112);
  auVar117 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar111);
  auVar108 = vsubps_avx(auVar136,auVar158);
  fVar1 = auVar108._0_4_;
  fVar3 = auVar108._4_4_;
  fVar55 = auVar108._8_4_;
  fVar58 = auVar108._12_4_;
  fVar61 = auVar108._16_4_;
  fVar64 = auVar108._20_4_;
  fVar67 = auVar108._24_4_;
  auVar152._0_4_ = fVar1 * fVar1 + auVar115._0_4_;
  auVar152._4_4_ = fVar3 * fVar3 + auVar115._4_4_;
  auVar152._8_4_ = fVar55 * fVar55 + auVar115._8_4_;
  auVar152._12_4_ = fVar58 * fVar58 + auVar115._12_4_;
  auVar152._16_4_ = fVar61 * fVar61 + auVar115._16_4_;
  auVar152._20_4_ = fVar64 * fVar64 + auVar115._20_4_;
  auVar152._24_4_ = fVar67 * fVar67 + auVar115._24_4_;
  auVar152._28_4_ = auVar118._28_4_ + auVar115._28_4_;
  auVar109 = vmulps_avx512vl(auVar107,_local_660);
  auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar114);
  auVar118 = vfmadd231ps_avx512vl(auVar109,auVar105,_local_7e0);
  auVar110 = _local_660;
  auVar109 = vmulps_avx512vl(_local_660,_local_660);
  auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar114);
  auVar119 = vfmadd231ps_avx512vl(auVar109,_local_7e0,_local_7e0);
  auVar120 = vmulps_avx512vl(auVar115,auVar115);
  auVar203 = ZEXT3264(auVar120);
  auVar121 = vmulps_avx512vl(auVar136,auVar115);
  fVar2 = auVar117._0_4_;
  fVar171 = fVar2 * fVar2;
  fVar53 = auVar117._4_4_;
  fVar173 = fVar53 * fVar53;
  auVar109._4_4_ = fVar173;
  auVar109._0_4_ = fVar171;
  fVar56 = auVar117._8_4_;
  fVar174 = fVar56 * fVar56;
  auVar109._8_4_ = fVar174;
  fVar59 = auVar117._12_4_;
  fVar175 = fVar59 * fVar59;
  auVar109._12_4_ = fVar175;
  fVar62 = auVar117._16_4_;
  fVar176 = fVar62 * fVar62;
  auVar109._16_4_ = fVar176;
  fVar65 = auVar117._20_4_;
  fVar177 = fVar65 * fVar65;
  auVar109._20_4_ = fVar177;
  fVar68 = auVar117._24_4_;
  fVar178 = fVar68 * fVar68;
  auVar109._24_4_ = fVar178;
  auVar109._28_4_ = local_7e0._28_4_;
  auVar109 = vmulps_avx512vl(auVar152,auVar109);
  auVar109 = vsubps_avx512vl(auVar120,auVar109);
  auVar118 = vmulps_avx512vl(auVar120,auVar118);
  auVar122 = vmulps_avx512vl(auVar117,auVar116);
  auVar122 = vmulps_avx512vl(auVar152,auVar122);
  auVar118 = vsubps_avx512vl(auVar118,auVar122);
  auVar122 = vmulps_avx512vl(auVar108,auVar117);
  auVar122 = vmulps_avx512vl(auVar121,auVar122);
  auVar118 = vaddps_avx512vl(auVar122,auVar118);
  auVar119 = vmulps_avx512vl(auVar120,auVar119);
  auVar122 = vmulps_avx512vl(auVar116,auVar116);
  auVar122 = vmulps_avx512vl(auVar152,auVar122);
  auVar119 = vsubps_avx512vl(auVar119,auVar122);
  auVar108 = vaddps_avx512vl(auVar108,auVar108);
  auVar108 = vmulps_avx512vl(auVar108,auVar116);
  auVar108 = vsubps_avx512vl(auVar108,auVar121);
  auVar108 = vmulps_avx512vl(auVar121,auVar108);
  auVar108 = vaddps_avx512vl(auVar119,auVar108);
  auVar119 = vmulps_avx512vl(auVar118,auVar118);
  auVar108 = vmulps_avx512vl(auVar109,auVar108);
  auVar108 = vsubps_avx512vl(auVar119,auVar108);
  auVar119 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar102 = vcmpps_avx512vl(auVar108,auVar119,5);
  bVar92 = (byte)(uVar75 & uVar102);
  if (bVar92 != 0) {
    auVar160 = vsubps_avx(auVar123,auVar160);
    auVar129 = vsubps_avx(auVar124,auVar129);
    auVar162 = vsubps_avx(auVar125,auVar162);
    auVar123 = vsqrtps_avx512vl(auVar108);
    auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar108 = vrcp14ps_avx512vl(auVar109);
    auVar125 = vfnmadd213ps_avx512vl(auVar108,auVar109,auVar124);
    auVar121._8_4_ = 0x7fffffff;
    auVar121._0_8_ = 0x7fffffff7fffffff;
    auVar121._12_4_ = 0x7fffffff;
    auVar121._16_4_ = 0x7fffffff;
    auVar121._20_4_ = 0x7fffffff;
    auVar121._24_4_ = 0x7fffffff;
    auVar121._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar109,auVar121);
    auVar122._8_4_ = 0x219392ef;
    auVar122._0_8_ = 0x219392ef219392ef;
    auVar122._12_4_ = 0x219392ef;
    auVar122._16_4_ = 0x219392ef;
    auVar122._20_4_ = 0x219392ef;
    auVar122._24_4_ = 0x219392ef;
    auVar122._28_4_ = 0x219392ef;
    uVar99 = vcmpps_avx512vl(auVar125,auVar122,2);
    auVar109 = vfmadd132ps_avx512vl(auVar125,auVar108,auVar108);
    auVar159._8_4_ = 0x80000000;
    auVar159._0_8_ = 0x8000000080000000;
    auVar159._12_4_ = 0x80000000;
    auVar159._16_4_ = 0x80000000;
    auVar159._20_4_ = 0x80000000;
    auVar159._24_4_ = 0x80000000;
    auVar159._28_4_ = 0x80000000;
    auVar108 = vxorps_avx512vl(auVar118,auVar159);
    auVar108 = vsubps_avx(auVar108,auVar123);
    auVar108 = vmulps_avx512vl(auVar108,auVar109);
    auVar181._8_4_ = 0xff800000;
    auVar181._0_8_ = 0xff800000ff800000;
    auVar181._12_4_ = 0xff800000;
    auVar181._16_4_ = 0xff800000;
    auVar181._20_4_ = 0xff800000;
    auVar181._24_4_ = 0xff800000;
    auVar181._28_4_ = 0xff800000;
    bVar13 = (bool)((byte)uVar99 & 1);
    auVar126._0_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._0_4_;
    bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._4_4_;
    bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._8_4_;
    bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._12_4_;
    bVar13 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._16_4_;
    bVar13 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._20_4_;
    bVar13 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._24_4_;
    bVar13 = SUB81(uVar99 >> 7,0);
    auVar126._28_4_ = (uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar108._28_4_;
    auVar108 = vsubps_avx512vl(auVar123,auVar118);
    auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar193 = ZEXT3264(auVar121);
    auVar108 = vmulps_avx512vl(auVar108,auVar109);
    bVar13 = (bool)((byte)uVar99 & 1);
    iVar103 = auVar121._0_4_;
    auVar127._0_4_ = (uint)bVar13 * iVar103 | (uint)!bVar13 * auVar108._0_4_;
    bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
    iVar140 = auVar121._4_4_;
    auVar127._4_4_ = (uint)bVar13 * iVar140 | (uint)!bVar13 * auVar108._4_4_;
    bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
    iVar141 = auVar121._8_4_;
    auVar127._8_4_ = (uint)bVar13 * iVar141 | (uint)!bVar13 * auVar108._8_4_;
    bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
    iVar142 = auVar121._12_4_;
    auVar127._12_4_ = (uint)bVar13 * iVar142 | (uint)!bVar13 * auVar108._12_4_;
    bVar13 = (bool)((byte)(uVar99 >> 4) & 1);
    iVar143 = auVar121._16_4_;
    auVar127._16_4_ = (uint)bVar13 * iVar143 | (uint)!bVar13 * auVar108._16_4_;
    bVar13 = (bool)((byte)(uVar99 >> 5) & 1);
    iVar144 = auVar121._20_4_;
    auVar127._20_4_ = (uint)bVar13 * iVar144 | (uint)!bVar13 * auVar108._20_4_;
    bVar13 = (bool)((byte)(uVar99 >> 6) & 1);
    iVar145 = auVar121._24_4_;
    auVar127._24_4_ = (uint)bVar13 * iVar145 | (uint)!bVar13 * auVar108._24_4_;
    bVar13 = SUB81(uVar99 >> 7,0);
    iVar146 = auVar121._28_4_;
    auVar127._28_4_ = (uint)bVar13 * iVar146 | (uint)!bVar13 * auVar108._28_4_;
    auVar108 = vmulps_avx512vl(auVar117,auVar126);
    auVar179._0_4_ = auVar116._0_4_ + auVar108._0_4_;
    auVar179._4_4_ = auVar116._4_4_ + auVar108._4_4_;
    auVar179._8_4_ = auVar116._8_4_ + auVar108._8_4_;
    auVar179._12_4_ = auVar116._12_4_ + auVar108._12_4_;
    auVar179._16_4_ = auVar116._16_4_ + auVar108._16_4_;
    auVar179._20_4_ = auVar116._20_4_ + auVar108._20_4_;
    auVar179._24_4_ = auVar116._24_4_ + auVar108._24_4_;
    fVar170 = auVar116._28_4_;
    auVar179._28_4_ = fVar170 + auVar108._28_4_;
    auVar108 = vmulps_avx512vl(auVar117,auVar127);
    auVar122 = vaddps_avx512vl(auVar116,auVar108);
    auVar202 = ZEXT3264(auVar122);
    uVar70 = vcmpps_avx512vl(auVar179,auVar115,1);
    uVar71 = vcmpps_avx512vl(auVar179,auVar119,6);
    uVar72 = vcmpps_avx512vl(auVar122,auVar115,1);
    uVar73 = vcmpps_avx512vl(auVar122,auVar119,6);
    auVar172._0_4_ = fVar2 * (float)local_7e0._0_4_;
    auVar172._4_4_ = fVar53 * (float)local_7e0._4_4_;
    auVar172._8_4_ = fVar56 * fStack_7d8;
    auVar172._12_4_ = fVar59 * fStack_7d4;
    auVar172._16_4_ = fVar62 * fStack_7d0;
    auVar172._20_4_ = fVar65 * fStack_7cc;
    auVar172._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar172._24_4_ = fVar68 * fStack_7c8;
    auVar108 = vmulps_avx512vl(auVar117,auVar114);
    auVar109 = vmulps_avx512vl(auVar117,_local_660);
    auVar118 = vmulps_avx512vl(auVar105,auVar116);
    auVar118 = vsubps_avx512vl(auVar172._0_32_,auVar118);
    auVar119 = vmulps_avx512vl(auVar106,auVar116);
    auVar108 = vsubps_avx512vl(auVar108,auVar119);
    auVar119 = vmulps_avx512vl(auVar107,auVar116);
    auVar109 = vsubps_avx512vl(auVar109,auVar119);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,auVar118);
    fVar52 = auVar136._0_4_;
    fVar54 = auVar136._4_4_;
    fVar57 = auVar136._8_4_;
    fVar60 = auVar136._12_4_;
    fVar63 = auVar136._16_4_;
    fVar66 = auVar136._20_4_;
    fVar69 = auVar136._24_4_;
    auVar77._4_4_ = fVar54 * fVar54 * fVar173;
    auVar77._0_4_ = fVar52 * fVar52 * fVar171;
    auVar77._8_4_ = fVar57 * fVar57 * fVar174;
    auVar77._12_4_ = fVar60 * fVar60 * fVar175;
    auVar77._16_4_ = fVar63 * fVar63 * fVar176;
    auVar77._20_4_ = fVar66 * fVar66 * fVar177;
    auVar77._24_4_ = fVar69 * fVar69 * fVar178;
    auVar77._28_4_ = auVar118._28_4_;
    uVar99 = vcmpps_avx512vl(auVar108,auVar77,1);
    uVar99 = (bVar92 & ~(byte)line->leftExists) & uVar99;
    auVar108 = vrcp14ps_avx512vl(auVar117);
    auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar117,auVar124);
    auVar119 = vfmadd132ps_avx512vl(auVar109,auVar108,auVar108);
    auVar165._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
    auVar165._8_4_ = -auVar116._8_4_;
    auVar165._12_4_ = -auVar116._12_4_;
    auVar165._16_4_ = -auVar116._16_4_;
    auVar165._20_4_ = -auVar116._20_4_;
    auVar165._24_4_ = -auVar116._24_4_;
    auVar165._28_4_ = -fVar170;
    auVar108 = vmulps_avx512vl(auVar119,auVar165);
    bVar13 = (bool)((byte)uVar99 & 1);
    auVar128._0_4_ = (uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * iVar103;
    bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * iVar140;
    bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * iVar141;
    bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * iVar142;
    bVar13 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * iVar143;
    bVar13 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * iVar144;
    bVar13 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * iVar145;
    bVar13 = SUB81(uVar99 >> 7,0);
    auVar128._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * iVar146;
    auVar192 = ZEXT3264(auVar128);
    auVar108 = vmulps_avx512vl(auVar113,auVar162);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar129,auVar112);
    auVar116 = vfmadd231ps_avx512vl(auVar108,auVar160,auVar111);
    auVar78._4_4_ = auVar160._4_4_ * fVar53;
    auVar78._0_4_ = auVar160._0_4_ * fVar2;
    auVar78._8_4_ = auVar160._8_4_ * fVar56;
    auVar78._12_4_ = auVar160._12_4_ * fVar59;
    auVar78._16_4_ = auVar160._16_4_ * fVar62;
    auVar78._20_4_ = auVar160._20_4_ * fVar65;
    auVar78._24_4_ = auVar160._24_4_ * fVar68;
    auVar78._28_4_ = fVar170;
    auVar79._4_4_ = auVar129._4_4_ * fVar53;
    auVar79._0_4_ = auVar129._0_4_ * fVar2;
    auVar79._8_4_ = auVar129._8_4_ * fVar56;
    auVar79._12_4_ = auVar129._12_4_ * fVar59;
    auVar79._16_4_ = auVar129._16_4_ * fVar62;
    auVar79._20_4_ = auVar129._20_4_ * fVar65;
    auVar79._24_4_ = auVar129._24_4_ * fVar68;
    auVar79._28_4_ = auVar160._28_4_;
    auVar80._4_4_ = auVar162._4_4_ * fVar53;
    auVar80._0_4_ = auVar162._0_4_ * fVar2;
    auVar80._8_4_ = auVar162._8_4_ * fVar56;
    auVar80._12_4_ = auVar162._12_4_ * fVar59;
    auVar80._16_4_ = auVar162._16_4_ * fVar62;
    auVar80._20_4_ = auVar162._20_4_ * fVar65;
    auVar80._24_4_ = auVar162._24_4_ * fVar68;
    auVar80._28_4_ = auVar117._28_4_;
    auVar108 = vmulps_avx512vl(auVar105,auVar116);
    auVar108 = vsubps_avx(auVar78,auVar108);
    auVar109 = vmulps_avx512vl(auVar106,auVar116);
    auVar109 = vsubps_avx(auVar79,auVar109);
    auVar129 = vmulps_avx512vl(auVar107,auVar116);
    auVar118 = vsubps_avx(auVar80,auVar129);
    auVar81._4_4_ = auVar118._4_4_ * auVar118._4_4_;
    auVar81._0_4_ = auVar118._0_4_ * auVar118._0_4_;
    auVar81._8_4_ = auVar118._8_4_ * auVar118._8_4_;
    auVar81._12_4_ = auVar118._12_4_ * auVar118._12_4_;
    auVar81._16_4_ = auVar118._16_4_ * auVar118._16_4_;
    auVar81._20_4_ = auVar118._20_4_ * auVar118._20_4_;
    auVar81._24_4_ = auVar118._24_4_ * auVar118._24_4_;
    auVar81._28_4_ = auVar118._28_4_;
    auVar104 = vfmadd231ps_fma(auVar81,auVar109,auVar109);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar108,auVar108);
    auVar82._4_4_ = fVar173 * auVar158._4_4_ * auVar158._4_4_;
    auVar82._0_4_ = fVar171 * auVar158._0_4_ * auVar158._0_4_;
    auVar82._8_4_ = fVar174 * auVar158._8_4_ * auVar158._8_4_;
    auVar82._12_4_ = fVar175 * auVar158._12_4_ * auVar158._12_4_;
    auVar82._16_4_ = fVar176 * auVar158._16_4_ * auVar158._16_4_;
    auVar82._20_4_ = fVar177 * auVar158._20_4_ * auVar158._20_4_;
    auVar82._24_4_ = fVar178 * auVar158._24_4_ * auVar158._24_4_;
    auVar82._28_4_ = auVar158._28_4_;
    uVar183 = *(undefined4 *)(ray + k * 4 + 0xc0);
    auVar168._4_4_ = uVar183;
    auVar168._0_4_ = uVar183;
    auVar168._8_4_ = uVar183;
    auVar168._12_4_ = uVar183;
    auVar168._16_4_ = uVar183;
    auVar168._20_4_ = uVar183;
    auVar168._24_4_ = uVar183;
    auVar168._28_4_ = uVar183;
    bVar100 = (byte)uVar70 & (byte)uVar71 & bVar92;
    auVar108 = vblendmps_avx512vl(auVar121,auVar126);
    auVar130._0_4_ =
         (uint)(bVar100 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar129._0_4_;
    bVar13 = (bool)(bVar100 >> 1 & 1);
    auVar130._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar129._4_4_;
    bVar13 = (bool)(bVar100 >> 2 & 1);
    auVar130._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar129._8_4_;
    bVar13 = (bool)(bVar100 >> 3 & 1);
    auVar130._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar129._12_4_;
    bVar13 = (bool)(bVar100 >> 4 & 1);
    auVar130._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar129._16_4_;
    bVar13 = (bool)(bVar100 >> 5 & 1);
    auVar130._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar129._20_4_;
    bVar13 = (bool)(bVar100 >> 6 & 1);
    auVar130._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar129._24_4_;
    auVar130._28_4_ =
         (uint)(bVar100 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar100 >> 7) * auVar129._28_4_;
    auVar186 = ZEXT3264(auVar130);
    bVar100 = (byte)uVar72 & (byte)uVar73 & bVar92;
    auVar108 = vblendmps_avx512vl(auVar181,auVar127);
    auVar131._0_4_ =
         (uint)(bVar100 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar100 & 1) * (int)auVar162._0_4_;
    bVar13 = (bool)(bVar100 >> 1 & 1);
    auVar131._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * (int)auVar162._4_4_;
    bVar13 = (bool)(bVar100 >> 2 & 1);
    auVar131._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * (int)auVar162._8_4_;
    bVar13 = (bool)(bVar100 >> 3 & 1);
    auVar131._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * (int)auVar162._12_4_;
    bVar13 = (bool)(bVar100 >> 4 & 1);
    auVar131._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * (int)auVar162._16_4_;
    bVar13 = (bool)(bVar100 >> 5 & 1);
    auVar131._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * (int)auVar162._20_4_;
    bVar13 = (bool)(bVar100 >> 6 & 1);
    auVar131._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * (int)auVar162._24_4_;
    auVar131._28_4_ =
         (uint)(bVar100 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar100 >> 7) * auVar162._28_4_;
    auVar187 = ZEXT3264(auVar131);
    auVar166._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
    auVar166._8_4_ = auVar116._8_4_ ^ 0x80000000;
    auVar166._12_4_ = auVar116._12_4_ ^ 0x80000000;
    auVar166._16_4_ = auVar116._16_4_ ^ 0x80000000;
    auVar166._20_4_ = auVar116._20_4_ ^ 0x80000000;
    auVar166._24_4_ = auVar116._24_4_ ^ 0x80000000;
    auVar166._28_4_ = auVar116._28_4_ ^ 0x80000000;
    uVar99 = vcmpps_avx512vl(ZEXT1632(auVar104),auVar82,1);
    uVar99 = (bVar92 & ~(byte)line->rightExists) & uVar99;
    auVar108 = vmulps_avx512vl(auVar119,auVar166);
    bVar13 = (bool)((byte)uVar99 & 1);
    auVar132._0_4_ = (uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * iVar103;
    bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar132._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * iVar140;
    bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar132._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * iVar141;
    bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar132._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * iVar142;
    bVar13 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar132._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * iVar143;
    bVar13 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar132._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * iVar144;
    bVar13 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar132._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * iVar145;
    bVar13 = SUB81(uVar99 >> 7,0);
    auVar132._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * iVar146;
    auVar109 = vminps_avx512vl(auVar128,auVar132);
    auVar118 = vmaxps_avx512vl(auVar128,auVar132);
    auVar108 = vminps_avx(auVar130,auVar109);
    uVar99 = vcmpps_avx512vl(auVar108,auVar109,0);
    uVar74 = vcmpps_avx512vl(auVar118,auVar121,0);
    bVar13 = (bool)((byte)uVar74 & 1);
    bVar16 = (bool)((byte)(uVar74 >> 1) & 1);
    bVar18 = (bool)((byte)(uVar74 >> 2) & 1);
    bVar20 = (bool)((byte)(uVar74 >> 3) & 1);
    bVar23 = (bool)((byte)(uVar74 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar74 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar74 >> 6) & 1);
    bVar47 = SUB81(uVar74 >> 7,0);
    uVar74 = vcmpps_avx512vl(auVar109,auVar121,0);
    bVar14 = (bool)((byte)uVar74 & 1);
    bVar17 = (bool)((byte)(uVar74 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar74 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar74 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar74 >> 4) & 1);
    bVar32 = (bool)((byte)(uVar74 >> 5) & 1);
    bVar40 = (bool)((byte)(uVar74 >> 6) & 1);
    bVar48 = SUB81(uVar74 >> 7,0);
    bVar15 = (bool)((byte)uVar99 & 1);
    auVar133._0_4_ =
         (uint)bVar15 * ((uint)bVar13 * -0x800000 | (uint)!bVar13 * auVar118._0_4_) |
         (uint)!bVar15 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar109._0_4_);
    bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar133._4_4_ =
         (uint)bVar13 * ((uint)bVar16 * -0x800000 | (uint)!bVar16 * auVar118._4_4_) |
         (uint)!bVar13 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar109._4_4_);
    bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar133._8_4_ =
         (uint)bVar13 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar118._8_4_) |
         (uint)!bVar13 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar109._8_4_);
    bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar133._12_4_ =
         (uint)bVar13 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar118._12_4_) |
         (uint)!bVar13 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar109._12_4_);
    bVar13 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar133._16_4_ =
         (uint)bVar13 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar118._16_4_) |
         (uint)!bVar13 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar109._16_4_);
    bVar13 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar133._20_4_ =
         (uint)bVar13 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar118._20_4_) |
         (uint)!bVar13 * ((uint)bVar32 * -0x800000 | (uint)!bVar32 * auVar109._20_4_);
    bVar13 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar133._24_4_ =
         (uint)bVar13 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar118._24_4_) |
         (uint)!bVar13 * ((uint)bVar40 * -0x800000 | (uint)!bVar40 * auVar109._24_4_);
    bVar13 = SUB81(uVar99 >> 7,0);
    auVar133._28_4_ =
         (uint)bVar13 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar118._28_4_) |
         (uint)!bVar13 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar109._28_4_);
    auVar109 = vmaxps_avx512vl(auVar131,auVar133);
    auVar188 = ZEXT3264(auVar109);
    auVar163._0_4_ = auVar147._0_4_ + auVar108._0_4_;
    auVar163._4_4_ = auVar147._4_4_ + auVar108._4_4_;
    auVar163._8_4_ = auVar147._8_4_ + auVar108._8_4_;
    auVar163._12_4_ = auVar147._12_4_ + auVar108._12_4_;
    auVar163._16_4_ = auVar147._16_4_ + auVar108._16_4_;
    auVar163._20_4_ = auVar147._20_4_ + auVar108._20_4_;
    auVar163._24_4_ = auVar147._24_4_ + auVar108._24_4_;
    auVar163._28_4_ = auVar108._28_4_ + 0.0;
    uVar99 = vcmpps_avx512vl(auVar168,auVar163,2);
    uVar183 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar184._4_4_ = uVar183;
    auVar184._0_4_ = uVar183;
    auVar184._8_4_ = uVar183;
    auVar184._12_4_ = uVar183;
    auVar184._16_4_ = uVar183;
    auVar184._20_4_ = uVar183;
    auVar184._24_4_ = uVar183;
    auVar184._28_4_ = uVar183;
    auVar185 = ZEXT3264(auVar184);
    uVar74 = vcmpps_avx512vl(auVar163,auVar184,2);
    auVar118 = vaddps_avx512vl(auVar147,auVar109);
    auVar172 = ZEXT3264(auVar118);
    uVar70 = vcmpps_avx512vl(auVar168,auVar118,2);
    uVar71 = vcmpps_avx512vl(auVar118,auVar184,2);
    uVar72 = vcmpps_avx512vl(auVar109,auVar181,4);
    bVar97 = (byte)uVar70 & (byte)uVar71 & (byte)uVar72;
    uVar101 = vcmpps_avx512vl(auVar108,auVar121,4);
    uVar101 = uVar99 & uVar74 & uVar101;
    bVar100 = (byte)uVar101 & bVar92;
    bVar91 = bVar92 & ((byte)uVar101 | bVar97);
    uVar98 = (uint)bVar91;
    if (bVar91 != 0) {
      auVar109 = vblendmps_avx512vl(auVar109,auVar108);
      auVar134._0_4_ =
           (float)((uint)(bVar100 & 1) * auVar109._0_4_ |
                  (uint)!(bool)(bVar100 & 1) * (int)auVar163._0_4_);
      bVar13 = (bool)(bVar100 >> 1 & 1);
      auVar134._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * (int)auVar163._4_4_);
      bVar13 = (bool)(bVar100 >> 2 & 1);
      auVar134._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * (int)auVar163._8_4_);
      bVar13 = (bool)(bVar100 >> 3 & 1);
      auVar134._12_4_ =
           (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * (int)auVar163._12_4_);
      bVar13 = (bool)(bVar100 >> 4 & 1);
      auVar134._16_4_ =
           (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * (int)auVar163._16_4_);
      bVar13 = (bool)(bVar100 >> 5 & 1);
      auVar134._20_4_ =
           (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * (int)auVar163._20_4_);
      bVar13 = (bool)(bVar100 >> 6 & 1);
      auVar134._24_4_ =
           (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * (int)auVar163._24_4_);
      auVar134._28_4_ =
           (float)((uint)(bVar100 >> 7) * auVar109._28_4_ |
                  (uint)!(bool)(bVar100 >> 7) * (int)auVar163._28_4_);
      auVar109 = vblendmps_avx512vl(auVar122,auVar179);
      auVar135._0_4_ =
           (float)((uint)(bVar100 & 1) * auVar109._0_4_ |
                  (uint)!(bool)(bVar100 & 1) * (int)auVar108._0_4_);
      bVar13 = (bool)(bVar100 >> 1 & 1);
      auVar135._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * (int)auVar108._4_4_);
      bVar13 = (bool)(bVar100 >> 2 & 1);
      auVar135._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * (int)auVar108._8_4_);
      bVar13 = (bool)(bVar100 >> 3 & 1);
      auVar135._12_4_ =
           (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * (int)auVar108._12_4_);
      bVar13 = (bool)(bVar100 >> 4 & 1);
      auVar135._16_4_ =
           (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * (int)auVar108._16_4_);
      bVar13 = (bool)(bVar100 >> 5 & 1);
      auVar135._20_4_ =
           (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * (int)auVar108._20_4_);
      bVar13 = (bool)(bVar100 >> 6 & 1);
      auVar135._24_4_ =
           (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * (int)auVar108._24_4_);
      auVar135._28_4_ =
           (uint)(bVar100 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar100 >> 7) * (int)auVar108._28_4_;
      auVar108 = vrcp14ps_avx512vl(auVar115);
      auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar115,auVar124);
      auVar104 = vfmadd132ps_fma(auVar109,auVar108,auVar108);
      auVar180 = ZEXT1664(auVar104);
      auVar83._4_4_ = fVar54 * fVar3 * auVar115._4_4_;
      auVar83._0_4_ = fVar52 * fVar1 * auVar115._0_4_;
      auVar83._8_4_ = fVar57 * fVar55 * auVar115._8_4_;
      auVar83._12_4_ = fVar60 * fVar58 * auVar115._12_4_;
      auVar83._16_4_ = fVar63 * fVar61 * auVar115._16_4_;
      auVar83._20_4_ = fVar66 * fVar64 * auVar115._20_4_;
      auVar83._24_4_ = fVar69 * fVar67 * auVar115._24_4_;
      auVar83._28_4_ = auVar136._28_4_;
      _local_2e0 = vmulps_avx512vl(auVar111,auVar83);
      auVar108 = vmulps_avx512vl(auVar112,auVar83);
      auVar189 = ZEXT3264(auVar108);
      auVar109 = vmulps_avx512vl(auVar111,auVar152);
      auVar190 = ZEXT3264(auVar109);
      auVar118 = vmulps_avx512vl(auVar112,auVar152);
      auVar200 = ZEXT3264(auVar118);
      uVar70 = vcmpps_avx512vl(auVar134,auVar130,0);
      uVar71 = vcmpps_avx512vl(auVar134,auVar131,0);
      bVar76 = ((byte)uVar70 | (byte)uVar71) & bVar92;
      uVar99 = vcmpps_avx512vl(auVar134,auVar128,0);
      uVar99 = uVar75 & uVar102 & uVar99;
      auVar136 = vmulps_avx512vl(auVar105,auVar134);
      auVar155._0_4_ = auVar136._0_4_ + (float)local_7e0._0_4_;
      auVar155._4_4_ = auVar136._4_4_ + (float)local_7e0._4_4_;
      auVar155._8_4_ = auVar136._8_4_ + fStack_7d8;
      auVar155._12_4_ = auVar136._12_4_ + fStack_7d4;
      auVar155._16_4_ = auVar136._16_4_ + fStack_7d0;
      auVar155._20_4_ = auVar136._20_4_ + fStack_7cc;
      auVar155._24_4_ = auVar136._24_4_ + fStack_7c8;
      auVar155._28_4_ = auVar136._28_4_ + local_7e0._28_4_;
      auVar136 = vmulps_avx512vl(auVar120,auVar155);
      auVar156._0_4_ = local_2e0._0_4_ + auVar136._0_4_;
      auVar156._4_4_ = local_2e0._4_4_ + auVar136._4_4_;
      auVar156._8_4_ = local_2e0._8_4_ + auVar136._8_4_;
      auVar156._12_4_ = local_2e0._12_4_ + auVar136._12_4_;
      auVar156._16_4_ = local_2e0._16_4_ + auVar136._16_4_;
      auVar156._20_4_ = local_2e0._20_4_ + auVar136._20_4_;
      auVar156._24_4_ = local_2e0._24_4_ + auVar136._24_4_;
      auVar156._28_4_ = local_2e0._28_4_ + auVar136._28_4_;
      auVar109 = vmulps_avx512vl(auVar109,auVar135);
      local_300 = vxorps_avx512vl(auVar111,auVar159);
      auVar136 = vblendmps_avx512vl(auVar111,local_300);
      bVar100 = (byte)uVar99;
      bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar99 >> 6) & 1);
      bVar20 = SUB81(uVar99 >> 7,0);
      auVar109 = vsubps_avx512vl(auVar156,auVar109);
      local_720._0_4_ =
           (uint)(bVar76 & 1) * auVar109._0_4_ |
           (uint)!(bool)(bVar76 & 1) *
           ((uint)(bVar100 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar100 & 1) * local_300._0_4_);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_720._4_4_ =
           (uint)bVar14 * auVar109._4_4_ |
           (uint)!bVar14 * ((uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * local_300._4_4_);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_720._8_4_ =
           (uint)bVar13 * auVar109._8_4_ |
           (uint)!bVar13 * ((uint)bVar15 * auVar136._8_4_ | (uint)!bVar15 * local_300._8_4_);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_720._12_4_ =
           (uint)bVar13 * auVar109._12_4_ |
           (uint)!bVar13 * ((uint)bVar16 * auVar136._12_4_ | (uint)!bVar16 * local_300._12_4_);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      local_720._16_4_ =
           (uint)bVar13 * auVar109._16_4_ |
           (uint)!bVar13 * ((uint)bVar17 * auVar136._16_4_ | (uint)!bVar17 * local_300._16_4_);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      local_720._20_4_ =
           (uint)bVar13 * auVar109._20_4_ |
           (uint)!bVar13 * ((uint)bVar18 * auVar136._20_4_ | (uint)!bVar18 * local_300._20_4_);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      local_720._24_4_ =
           (uint)bVar13 * auVar109._24_4_ |
           (uint)!bVar13 * ((uint)bVar19 * auVar136._24_4_ | (uint)!bVar19 * local_300._24_4_);
      local_720._28_4_ =
           (uint)(bVar76 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar76 >> 7) *
           ((uint)bVar20 * auVar136._28_4_ | (uint)!bVar20 * local_300._28_4_);
      auVar167 = ZEXT3264(local_720);
      auVar109 = vmulps_avx512vl(auVar106,auVar134);
      auVar109 = vaddps_avx512vl(auVar114,auVar109);
      auVar109 = vmulps_avx512vl(auVar120,auVar109);
      auVar108 = vaddps_avx512vl(auVar108,auVar109);
      iVar140 = (uint)!(bool)(bVar100 & 1) * auVar124._0_4_;
      iVar103 = (uint)!(bool)((byte)(uVar99 >> 1) & 1) * auVar124._4_4_;
      iVar141 = (uint)!(bool)((byte)(uVar99 >> 2) & 1) * auVar124._8_4_;
      iVar142 = (uint)!(bool)((byte)(uVar99 >> 3) & 1) * auVar124._12_4_;
      iVar143 = (uint)!(bool)((byte)(uVar99 >> 4) & 1) * auVar124._16_4_;
      iVar144 = (uint)!(bool)((byte)(uVar99 >> 5) & 1) * auVar124._20_4_;
      iVar145 = (uint)!(bool)((byte)(uVar99 >> 6) & 1) * auVar124._24_4_;
      iVar146 = (uint)!SUB81(uVar99 >> 7,0) * auVar124._28_4_;
      auVar191 = ZEXT3264(CONCAT428(iVar146,CONCAT424(iVar145,CONCAT420(iVar144,CONCAT416(iVar143,
                                                  CONCAT412(iVar142,CONCAT48(iVar141,CONCAT44(
                                                  iVar103,iVar140))))))));
      auVar109 = vmulps_avx512vl(auVar135,ZEXT1632(auVar104));
      bVar13 = (bool)(bVar76 >> 1 & 1);
      bVar14 = (bool)(bVar76 >> 2 & 1);
      bVar15 = (bool)(bVar76 >> 3 & 1);
      bVar16 = (bool)(bVar76 >> 4 & 1);
      bVar17 = (bool)(bVar76 >> 5 & 1);
      bVar18 = (bool)(bVar76 >> 6 & 1);
      local_780[0] = (uint)(bVar76 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar76 & 1) * iVar140;
      local_780[1] = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * iVar103;
      local_780[2] = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * iVar141;
      local_780[3] = (uint)bVar15 * auVar109._12_4_ | (uint)!bVar15 * iVar142;
      uStack_770 = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * iVar143;
      uStack_76c = (uint)bVar17 * auVar109._20_4_ | (uint)!bVar17 * iVar144;
      uStack_768 = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * iVar145;
      uStack_764 = (uint)(bVar76 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar76 >> 7) * iVar146;
      auVar109 = vmulps_avx512vl(auVar118,auVar135);
      local_760 = ZEXT432(0) << 0x20;
      auVar118 = vxorps_avx512vl(auVar112,auVar159);
      auVar169 = ZEXT3264(auVar118);
      local_740._0_4_ = auVar147._0_4_ + auVar134._0_4_;
      local_740._4_4_ = auVar147._4_4_ + auVar134._4_4_;
      local_740._8_4_ = auVar147._8_4_ + auVar134._8_4_;
      local_740._12_4_ = auVar147._12_4_ + auVar134._12_4_;
      local_740._16_4_ = auVar147._16_4_ + auVar134._16_4_;
      local_740._20_4_ = auVar147._20_4_ + auVar134._20_4_;
      local_740._24_4_ = auVar147._24_4_ + auVar134._24_4_;
      local_740._28_4_ = auVar134._28_4_ + 0.0;
      auVar118 = vblendmps_avx512vl(auVar112,auVar118);
      bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar99 >> 6) & 1);
      auVar108 = vsubps_avx512vl(auVar108,auVar109);
      local_700[0] = (uint)(bVar76 & 1) * auVar108._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar100 & 1) * auVar118._0_4_ |
                     (uint)!(bool)(bVar100 & 1) * (int)auVar147._0_4_);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_700[1] = (uint)bVar14 * auVar108._4_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * (int)auVar147._4_4_);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_700[2] = (uint)bVar13 * auVar108._8_4_ |
                     (uint)!bVar13 *
                     ((uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * (int)auVar147._8_4_);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_700[3] = (uint)bVar13 * auVar108._12_4_ |
                     (uint)!bVar13 *
                     ((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * (int)auVar147._12_4_);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      uStack_6f0 = (uint)bVar13 * auVar108._16_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar17 * auVar118._16_4_ | (uint)!bVar17 * (int)auVar147._16_4_);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      uStack_6ec = (uint)bVar13 * auVar108._20_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar18 * auVar118._20_4_ | (uint)!bVar18 * (int)auVar147._20_4_);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      uStack_6e8 = (uint)bVar13 * auVar108._24_4_ |
                   (uint)!bVar13 *
                   ((uint)bVar19 * auVar118._24_4_ | (uint)!bVar19 * (int)auVar147._24_4_);
      uStack_6e4 = (uint)(bVar76 >> 7) * auVar108._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) * (uint)(byte)(uVar99 >> 7) * auVar118._28_4_;
      _local_340 = vmulps_avx512vl(auVar113,auVar83);
      auVar108 = vmulps_avx512vl(auVar113,auVar152);
      auVar161 = ZEXT3264(auVar108);
      auVar109 = vmulps_avx512vl(auVar107,auVar134);
      auVar107._0_4_ = auVar109._0_4_ + (float)local_660._0_4_;
      auVar107._4_4_ = auVar109._4_4_ + (float)local_660._4_4_;
      auVar107._8_4_ = auVar109._8_4_ + fStack_658;
      auVar107._12_4_ = auVar109._12_4_ + fStack_654;
      auVar107._16_4_ = auVar109._16_4_ + fStack_650;
      auVar107._20_4_ = auVar109._20_4_ + fStack_64c;
      auVar107._24_4_ = auVar109._24_4_ + fStack_648;
      auVar107._28_4_ = auVar109._28_4_ + fStack_644;
      auVar109 = vmulps_avx512vl(auVar120,auVar107);
      auVar120._0_4_ = local_340._0_4_ + auVar109._0_4_;
      auVar120._4_4_ = local_340._4_4_ + auVar109._4_4_;
      auVar120._8_4_ = local_340._8_4_ + auVar109._8_4_;
      auVar120._12_4_ = local_340._12_4_ + auVar109._12_4_;
      auVar120._16_4_ = local_340._16_4_ + auVar109._16_4_;
      auVar120._20_4_ = local_340._20_4_ + auVar109._20_4_;
      auVar120._24_4_ = local_340._24_4_ + auVar109._24_4_;
      auVar120._28_4_ = local_340._28_4_ + auVar109._28_4_;
      auVar105._4_4_ = auVar108._4_4_ * auVar135._4_4_;
      auVar105._0_4_ = auVar108._0_4_ * auVar135._0_4_;
      auVar105._8_4_ = auVar108._8_4_ * auVar135._8_4_;
      auVar105._12_4_ = auVar108._12_4_ * auVar135._12_4_;
      auVar105._16_4_ = auVar108._16_4_ * auVar135._16_4_;
      auVar105._20_4_ = auVar108._20_4_ * auVar135._20_4_;
      auVar105._24_4_ = auVar108._24_4_ * auVar135._24_4_;
      auVar105._28_4_ = auVar152._28_4_;
      local_320 = vxorps_avx512vl(auVar113,auVar159);
      auVar108 = vblendmps_avx512vl(auVar113,local_320);
      bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar18 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar19 = (bool)((byte)(uVar99 >> 6) & 1);
      bVar20 = SUB81(uVar99 >> 7,0);
      auVar157 = ZEXT3264(local_740);
      auVar109 = vsubps_avx512vl(auVar120,auVar105);
      local_6e0[0] = (uint)(bVar76 & 1) * auVar109._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar100 & 1) * auVar108._0_4_ | !(bool)(bVar100 & 1) * local_700[0]);
      bVar14 = (bool)(bVar76 >> 1 & 1);
      local_6e0[1] = (uint)bVar14 * auVar109._4_4_ |
                     (uint)!bVar14 * ((uint)bVar13 * auVar108._4_4_ | !bVar13 * local_700[1]);
      bVar13 = (bool)(bVar76 >> 2 & 1);
      local_6e0[2] = (uint)bVar13 * auVar109._8_4_ |
                     (uint)!bVar13 * ((uint)bVar15 * auVar108._8_4_ | !bVar15 * local_700[2]);
      bVar13 = (bool)(bVar76 >> 3 & 1);
      local_6e0[3] = (uint)bVar13 * auVar109._12_4_ |
                     (uint)!bVar13 * ((uint)bVar16 * auVar108._12_4_ | !bVar16 * local_700[3]);
      bVar13 = (bool)(bVar76 >> 4 & 1);
      uStack_6d0 = (uint)bVar13 * auVar109._16_4_ |
                   (uint)!bVar13 * ((uint)bVar17 * auVar108._16_4_ | !bVar17 * uStack_6f0);
      bVar13 = (bool)(bVar76 >> 5 & 1);
      uStack_6cc = (uint)bVar13 * auVar109._20_4_ |
                   (uint)!bVar13 * ((uint)bVar18 * auVar108._20_4_ | !bVar18 * uStack_6ec);
      bVar13 = (bool)(bVar76 >> 6 & 1);
      uStack_6c8 = (uint)bVar13 * auVar109._24_4_ |
                   (uint)!bVar13 * ((uint)bVar19 * auVar108._24_4_ | !bVar19 * uStack_6e8);
      uStack_6c4 = (uint)(bVar76 >> 7) * auVar109._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) *
                   ((uint)bVar20 * auVar108._28_4_ | !bVar20 * uStack_6e4);
      auVar108 = vblendmps_avx512vl(auVar121,local_740);
      auVar106._0_4_ = (uint)(bVar91 & 1) * auVar108._0_4_ | !(bool)(bVar91 & 1) * local_6e0[0];
      bVar13 = (bool)(bVar91 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar13 * auVar108._4_4_ | !bVar13 * local_6e0[1];
      bVar13 = (bool)(bVar91 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar13 * auVar108._8_4_ | !bVar13 * local_6e0[2];
      bVar13 = (bool)(bVar91 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar13 * auVar108._12_4_ | !bVar13 * local_6e0[3];
      bVar13 = (bool)(bVar91 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar13 * auVar108._16_4_ | !bVar13 * uStack_6d0;
      bVar13 = (bool)(bVar91 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar13 * auVar108._20_4_ | !bVar13 * uStack_6cc;
      bVar13 = (bool)(bVar91 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar13 * auVar108._24_4_ | !bVar13 * uStack_6c8;
      auVar106._28_4_ = (uint)(bVar91 >> 7) * auVar108._28_4_ | !(bool)(bVar91 >> 7) * uStack_6c4;
      auVar108 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar108 = vminps_avx(auVar106,auVar108);
      auVar109 = vshufpd_avx(auVar108,auVar108,5);
      auVar108 = vminps_avx(auVar108,auVar109);
      auVar109 = vpermpd_avx2(auVar108,0x4e);
      auVar108 = vminps_avx(auVar108,auVar109);
      uVar70 = vcmpps_avx512vl(auVar106,auVar108,0);
      uVar94 = uVar98;
      if (((byte)uVar70 & bVar91) != 0) {
        uVar94 = (uint)((byte)uVar70 & bVar91);
      }
      uVar93 = 0;
      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
        uVar93 = uVar93 + 1;
      }
      auVar164 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar108 = vpcmpeqd_avx2(local_740,local_740);
      auVar182 = ZEXT3264(auVar108);
      _local_660 = auVar110;
LAB_01c55c0e:
      bVar100 = (byte)uVar101;
      local_810.hit = local_2c0;
      local_810.valid = (int *)local_6c0;
      auVar109 = auVar167._0_32_;
      auVar160 = auVar191._0_32_;
      auVar118 = auVar180._0_32_;
      auVar116 = auVar199._0_32_;
      auVar113 = auVar198._0_32_;
      auVar110 = auVar169._0_32_;
      auVar112 = auVar197._0_32_;
      auVar108 = auVar161._0_32_;
      auVar117 = auVar200._0_32_;
      auVar120 = auVar202._0_32_;
      auVar158 = auVar190._0_32_;
      auVar129 = auVar189._0_32_;
      auVar121 = auVar203._0_32_;
      auVar119 = auVar201._0_32_;
      auVar111 = auVar196._0_32_;
      auVar107 = auVar195._0_32_;
      auVar105 = auVar194._0_32_;
      auVar162 = auVar192._0_32_;
      auVar114 = auVar187._0_32_;
      auVar115 = auVar188._0_32_;
      auVar136 = auVar186._0_32_;
      uVar96 = uVar93 & 0xff;
      uVar94 = *(uint *)(local_360 + (ulong)uVar96 * 4);
      pGVar10 = (pSVar9->geometries).items[uVar94].ptr;
      local_810.ray = (RTCRayN *)ray;
      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
        uVar98 = (uint)(byte)(~(byte)(1 << (uVar93 & 0x1f)) & (byte)uVar98);
        auVar148 = auVar106;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar102 = (ulong)(uVar96 << 2);
          uVar183 = *(undefined4 *)((long)local_780 + uVar102);
          uVar4 = *(undefined4 *)(local_760 + uVar102);
          auVar185 = ZEXT464(*(uint *)(local_740 + uVar102));
          *(uint *)(ray + k * 4 + 0x200) = *(uint *)(local_740 + uVar102);
          *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)(local_720 + uVar102);
          *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_700 + uVar102);
          *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6e0 + uVar102);
          *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar183;
          *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x440) =
               *(undefined4 *)((long)&(line->primIDs).field_0 + uVar102);
          *(uint *)(ray + k * 4 + 0x480) = uVar94;
          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01c5628f:
          uVar183 = auVar185._0_4_;
          auVar149._4_4_ = uVar183;
          auVar149._0_4_ = uVar183;
          auVar149._8_4_ = uVar183;
          auVar149._12_4_ = uVar183;
          auVar149._16_4_ = uVar183;
          auVar149._20_4_ = uVar183;
          auVar149._24_4_ = uVar183;
          auVar149._28_4_ = uVar183;
          local_740 = auVar172._0_32_;
          uVar70 = vcmpps_avx512vl(local_740,auVar149,2);
          bVar92 = bVar100 & (byte)uVar70 & bVar97 & bVar92;
          uVar98 = (uint)bVar92;
          if (bVar92 == 0) {
            return;
          }
          uVar70 = vcmpps_avx512vl(auVar115,auVar136,0);
          uVar71 = vcmpps_avx512vl(auVar115,auVar114,0);
          bVar91 = (byte)uVar70 | (byte)uVar71;
          uVar102 = vcmpps_avx512vl(auVar115,auVar162,0);
          auVar136 = vmulps_avx512vl(auVar105,auVar115);
          auVar114 = vmulps_avx512vl(auVar107,auVar115);
          auVar115 = vmulps_avx512vl(auVar111,auVar115);
          auVar150._0_4_ = auVar136._0_4_ + (float)local_7e0._0_4_;
          auVar150._4_4_ = auVar136._4_4_ + (float)local_7e0._4_4_;
          auVar150._8_4_ = auVar136._8_4_ + fStack_7d8;
          auVar150._12_4_ = auVar136._12_4_ + fStack_7d4;
          auVar150._16_4_ = auVar136._16_4_ + fStack_7d0;
          auVar150._20_4_ = auVar136._20_4_ + fStack_7cc;
          auVar150._24_4_ = auVar136._24_4_ + fStack_7c8;
          auVar150._28_4_ = auVar136._28_4_ + fStack_7c4;
          auVar136 = vaddps_avx512vl(auVar119,auVar114);
          auVar153._0_4_ = auVar115._0_4_ + (float)local_660._0_4_;
          auVar153._4_4_ = auVar115._4_4_ + (float)local_660._4_4_;
          auVar153._8_4_ = auVar115._8_4_ + fStack_658;
          auVar153._12_4_ = auVar115._12_4_ + fStack_654;
          auVar153._16_4_ = auVar115._16_4_ + fStack_650;
          auVar153._20_4_ = auVar115._20_4_ + fStack_64c;
          auVar153._24_4_ = auVar115._24_4_ + fStack_648;
          auVar153._28_4_ = auVar115._28_4_ + fStack_644;
          auVar114 = vmulps_avx512vl(auVar121,auVar150);
          auVar136 = vmulps_avx512vl(auVar121,auVar136);
          auVar115 = vmulps_avx512vl(auVar121,auVar153);
          auVar151._0_4_ = auVar114._0_4_ + (float)local_2e0._0_4_;
          auVar151._4_4_ = auVar114._4_4_ + (float)local_2e0._4_4_;
          auVar151._8_4_ = auVar114._8_4_ + fStack_2d8;
          auVar151._12_4_ = auVar114._12_4_ + fStack_2d4;
          auVar151._16_4_ = auVar114._16_4_ + fStack_2d0;
          auVar151._20_4_ = auVar114._20_4_ + fStack_2cc;
          auVar151._24_4_ = auVar114._24_4_ + fStack_2c8;
          auVar151._28_4_ = auVar114._28_4_ + fStack_2c4;
          auVar136 = vaddps_avx512vl(auVar129,auVar136);
          auVar154._0_4_ = auVar115._0_4_ + (float)local_340._0_4_;
          auVar154._4_4_ = auVar115._4_4_ + (float)local_340._4_4_;
          auVar154._8_4_ = auVar115._8_4_ + fStack_338;
          auVar154._12_4_ = auVar115._12_4_ + fStack_334;
          auVar154._16_4_ = auVar115._16_4_ + fStack_330;
          auVar154._20_4_ = auVar115._20_4_ + fStack_32c;
          auVar154._24_4_ = auVar115._24_4_ + fStack_328;
          auVar154._28_4_ = auVar115._28_4_ + fStack_324;
          auVar114 = vmulps_avx512vl(auVar158,auVar120);
          auVar115 = vmulps_avx512vl(auVar117,auVar120);
          auVar108 = vmulps_avx512vl(auVar108,auVar120);
          bVar100 = (byte)uVar102;
          bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar102 >> 2) & 1);
          bVar32 = (bool)((byte)(uVar102 >> 3) & 1);
          bVar25 = (bool)((byte)(uVar102 >> 4) & 1);
          bVar33 = (bool)((byte)(uVar102 >> 5) & 1);
          bVar41 = (bool)((byte)(uVar102 >> 6) & 1);
          bVar49 = SUB81(uVar102 >> 7,0);
          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar102 >> 2) & 1);
          bVar39 = (bool)((byte)(uVar102 >> 3) & 1);
          bVar26 = (bool)((byte)(uVar102 >> 4) & 1);
          bVar34 = (bool)((byte)(uVar102 >> 5) & 1);
          bVar42 = (bool)((byte)(uVar102 >> 6) & 1);
          bVar50 = SUB81(uVar102 >> 7,0);
          bVar15 = (bool)((byte)(uVar102 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar102 >> 2) & 1);
          bVar40 = (bool)((byte)(uVar102 >> 3) & 1);
          bVar27 = (bool)((byte)(uVar102 >> 4) & 1);
          bVar35 = (bool)((byte)(uVar102 >> 5) & 1);
          bVar43 = (bool)((byte)(uVar102 >> 6) & 1);
          bVar51 = SUB81(uVar102 >> 7,0);
          auVar114 = vsubps_avx512vl(auVar151,auVar114);
          bVar16 = (bool)(bVar91 >> 1 & 1);
          bVar23 = (bool)(bVar91 >> 2 & 1);
          bVar47 = (bool)(bVar91 >> 3 & 1);
          bVar28 = (bool)(bVar91 >> 4 & 1);
          bVar36 = (bool)(bVar91 >> 5 & 1);
          bVar44 = (bool)(bVar91 >> 6 & 1);
          auVar136 = vsubps_avx512vl(auVar136,auVar115);
          bVar17 = (bool)(bVar91 >> 1 & 1);
          bVar24 = (bool)(bVar91 >> 2 & 1);
          bVar48 = (bool)(bVar91 >> 3 & 1);
          bVar29 = (bool)(bVar91 >> 4 & 1);
          bVar37 = (bool)(bVar91 >> 5 & 1);
          bVar45 = (bool)(bVar91 >> 6 & 1);
          auVar118 = vmulps_avx512vl(auVar120,auVar118);
          bVar18 = (bool)(bVar91 >> 1 & 1);
          bVar31 = (bool)(bVar91 >> 2 & 1);
          bVar22 = (bool)(bVar91 >> 3 & 1);
          bVar30 = (bool)(bVar91 >> 4 & 1);
          bVar38 = (bool)(bVar91 >> 5 & 1);
          bVar46 = (bool)(bVar91 >> 6 & 1);
          local_780[0] = (uint)(bVar91 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar91 & 1) * auVar160._0_4_;
          local_780[1] = (uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar160._4_4_;
          local_780[2] = (uint)bVar31 * auVar118._8_4_ | (uint)!bVar31 * auVar160._8_4_;
          local_780[3] = (uint)bVar22 * auVar118._12_4_ | (uint)!bVar22 * auVar160._12_4_;
          uStack_770 = (uint)bVar30 * auVar118._16_4_ | (uint)!bVar30 * auVar160._16_4_;
          uStack_76c = (uint)bVar38 * auVar118._20_4_ | (uint)!bVar38 * auVar160._20_4_;
          uStack_768 = (uint)bVar46 * auVar118._24_4_ | (uint)!bVar46 * auVar160._24_4_;
          uStack_764 = (uint)(bVar91 >> 7) * auVar118._28_4_ |
                       (uint)!(bool)(bVar91 >> 7) * auVar160._28_4_;
          auVar108 = vsubps_avx512vl(auVar154,auVar108);
          bVar18 = (bool)(bVar91 >> 1 & 1);
          bVar31 = (bool)(bVar91 >> 2 & 1);
          bVar22 = (bool)(bVar91 >> 3 & 1);
          bVar30 = (bool)(bVar91 >> 4 & 1);
          bVar38 = (bool)(bVar91 >> 5 & 1);
          bVar46 = (bool)(bVar91 >> 6 & 1);
          local_760 = ZEXT432(0) << 0x20;
          local_720._4_4_ =
               (uint)bVar16 * auVar114._4_4_ |
               (uint)!bVar16 * ((uint)bVar13 * local_300._4_4_ | (uint)!bVar13 * auVar112._4_4_);
          local_720._0_4_ =
               (uint)(bVar91 & 1) * auVar114._0_4_ |
               (uint)!(bool)(bVar91 & 1) *
               ((uint)(bVar100 & 1) * local_300._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar112._0_4_)
          ;
          local_720._8_4_ =
               (uint)bVar23 * auVar114._8_4_ |
               (uint)!bVar23 * ((uint)bVar19 * local_300._8_4_ | (uint)!bVar19 * auVar112._8_4_);
          local_720._12_4_ =
               (uint)bVar47 * auVar114._12_4_ |
               (uint)!bVar47 * ((uint)bVar32 * local_300._12_4_ | (uint)!bVar32 * auVar112._12_4_);
          local_720._16_4_ =
               (uint)bVar28 * auVar114._16_4_ |
               (uint)!bVar28 * ((uint)bVar25 * local_300._16_4_ | (uint)!bVar25 * auVar112._16_4_);
          local_720._20_4_ =
               (uint)bVar36 * auVar114._20_4_ |
               (uint)!bVar36 * ((uint)bVar33 * local_300._20_4_ | (uint)!bVar33 * auVar112._20_4_);
          local_720._24_4_ =
               (uint)bVar44 * auVar114._24_4_ |
               (uint)!bVar44 * ((uint)bVar41 * local_300._24_4_ | (uint)!bVar41 * auVar112._24_4_);
          local_720._28_4_ =
               (uint)(bVar91 >> 7) * auVar114._28_4_ |
               (uint)!(bool)(bVar91 >> 7) *
               ((uint)bVar49 * local_300._28_4_ | (uint)!bVar49 * auVar112._28_4_);
          local_700[0] = (uint)(bVar91 & 1) * auVar136._0_4_ |
                         (uint)!(bool)(bVar91 & 1) *
                         ((uint)(bVar100 & 1) * auVar110._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * auVar113._0_4_);
          local_700[1] = (uint)bVar17 * auVar136._4_4_ |
                         (uint)!bVar17 *
                         ((uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar113._4_4_);
          local_700[2] = (uint)bVar24 * auVar136._8_4_ |
                         (uint)!bVar24 *
                         ((uint)bVar20 * auVar110._8_4_ | (uint)!bVar20 * auVar113._8_4_);
          local_700[3] = (uint)bVar48 * auVar136._12_4_ |
                         (uint)!bVar48 *
                         ((uint)bVar39 * auVar110._12_4_ | (uint)!bVar39 * auVar113._12_4_);
          uStack_6f0 = (uint)bVar29 * auVar136._16_4_ |
                       (uint)!bVar29 *
                       ((uint)bVar26 * auVar110._16_4_ | (uint)!bVar26 * auVar113._16_4_);
          uStack_6ec = (uint)bVar37 * auVar136._20_4_ |
                       (uint)!bVar37 *
                       ((uint)bVar34 * auVar110._20_4_ | (uint)!bVar34 * auVar113._20_4_);
          uStack_6e8 = (uint)bVar45 * auVar136._24_4_ |
                       (uint)!bVar45 *
                       ((uint)bVar42 * auVar110._24_4_ | (uint)!bVar42 * auVar113._24_4_);
          uStack_6e4 = (uint)(bVar91 >> 7) * auVar136._28_4_ |
                       (uint)!(bool)(bVar91 >> 7) *
                       ((uint)bVar50 * auVar110._28_4_ | (uint)!bVar50 * auVar113._28_4_);
          local_6e0[0] = (uint)(bVar91 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar91 & 1) *
                         ((uint)(bVar100 & 1) * local_320._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * auVar116._0_4_);
          local_6e0[1] = (uint)bVar18 * auVar108._4_4_ |
                         (uint)!bVar18 *
                         ((uint)bVar15 * local_320._4_4_ | (uint)!bVar15 * auVar116._4_4_);
          local_6e0[2] = (uint)bVar31 * auVar108._8_4_ |
                         (uint)!bVar31 *
                         ((uint)bVar21 * local_320._8_4_ | (uint)!bVar21 * auVar116._8_4_);
          local_6e0[3] = (uint)bVar22 * auVar108._12_4_ |
                         (uint)!bVar22 *
                         ((uint)bVar40 * local_320._12_4_ | (uint)!bVar40 * auVar116._12_4_);
          uStack_6d0 = (uint)bVar30 * auVar108._16_4_ |
                       (uint)!bVar30 *
                       ((uint)bVar27 * local_320._16_4_ | (uint)!bVar27 * auVar116._16_4_);
          uStack_6cc = (uint)bVar38 * auVar108._20_4_ |
                       (uint)!bVar38 *
                       ((uint)bVar35 * local_320._20_4_ | (uint)!bVar35 * auVar116._20_4_);
          uStack_6c8 = (uint)bVar46 * auVar108._24_4_ |
                       (uint)!bVar46 *
                       ((uint)bVar43 * local_320._24_4_ | (uint)!bVar43 * auVar116._24_4_);
          uStack_6c4 = (uint)(bVar91 >> 7) * auVar108._28_4_ |
                       (uint)!(bool)(bVar91 >> 7) *
                       ((uint)bVar51 * local_320._28_4_ | (uint)!bVar51 * auVar116._28_4_);
          auVar95 = (undefined1  [8])context->scene;
          auVar108 = vblendmps_avx512vl(auVar193._0_32_,local_740);
          auVar137._4_4_ = (uint)(bVar92 >> 1 & 1) * auVar108._4_4_;
          auVar137._0_4_ = (uint)(bVar92 & 1) * auVar108._0_4_;
          auVar137._8_4_ = (uint)(bVar92 >> 2 & 1) * auVar108._8_4_;
          auVar137._12_4_ = (uint)(bVar92 >> 3 & 1) * auVar108._12_4_;
          auVar137._16_4_ = (uint)(bVar92 >> 4 & 1) * auVar108._16_4_;
          auVar137._20_4_ = (uint)(bVar92 >> 5 & 1) * auVar108._20_4_;
          auVar137._24_4_ = (uint)(bVar92 >> 6 & 1) * auVar108._24_4_;
          auVar137._28_4_ = (uint)(bVar92 >> 7) * auVar108._28_4_;
          auVar108 = vshufps_avx(auVar137,auVar137,0xb1);
          auVar108 = vminps_avx(auVar137,auVar108);
          auVar110 = vshufpd_avx(auVar108,auVar108,5);
          auVar108 = vminps_avx(auVar108,auVar110);
          auVar110 = vpermpd_avx2(auVar108,0x4e);
          auVar108 = vminps_avx(auVar108,auVar110);
          uVar70 = vcmpps_avx512vl(auVar137,auVar108,0);
          uVar94 = uVar98;
          if (((byte)uVar70 & bVar92) != 0) {
            uVar94 = (uint)((byte)uVar70 & bVar92);
          }
          uVar93 = 0;
          for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
            uVar93 = uVar93 + 1;
          }
          auVar108 = vpcmpeqd_avx2(auVar109,auVar109);
          auVar194 = ZEXT3264(auVar108);
          do {
            local_810.hit = local_2c0;
            local_810.valid = (int *)local_6c0;
            uVar96 = uVar93 & 0xff;
            uVar94 = *(uint *)(local_360 + (ulong)uVar96 * 4);
            pGVar10 = (((Scene *)auVar95)->geometries).items[uVar94].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
              uVar98 = (uint)(byte)(~(byte)(1 << (uVar93 & 0x1f)) & (byte)uVar98);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar102 = (ulong)(uVar96 << 2);
                uVar183 = *(undefined4 *)((long)local_780 + uVar102);
                uVar4 = *(undefined4 *)(local_760 + uVar102);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar102);
                *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)(local_720 + uVar102);
                *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_700 + uVar102);
                *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6e0 + uVar102);
                *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar183;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x440) =
                     *(undefined4 *)((long)&(line->primIDs).field_0 + uVar102);
                *(uint *)(ray + k * 4 + 0x480) = uVar94;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                return;
              }
              uVar102 = (ulong)(uVar96 * 4);
              local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_780 + uVar102)));
              local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_760 + uVar102)));
              auVar195 = vpbroadcastd_avx512f();
              local_180 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar102)));
              auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_720 + uVar102)));
              local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_700 + uVar102)));
              local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6e0 + uVar102)));
              local_2c0[0] = (RTCHitN)auVar196[0];
              local_2c0[1] = (RTCHitN)auVar196[1];
              local_2c0[2] = (RTCHitN)auVar196[2];
              local_2c0[3] = (RTCHitN)auVar196[3];
              local_2c0[4] = (RTCHitN)auVar196[4];
              local_2c0[5] = (RTCHitN)auVar196[5];
              local_2c0[6] = (RTCHitN)auVar196[6];
              local_2c0[7] = (RTCHitN)auVar196[7];
              local_2c0[8] = (RTCHitN)auVar196[8];
              local_2c0[9] = (RTCHitN)auVar196[9];
              local_2c0[10] = (RTCHitN)auVar196[10];
              local_2c0[0xb] = (RTCHitN)auVar196[0xb];
              local_2c0[0xc] = (RTCHitN)auVar196[0xc];
              local_2c0[0xd] = (RTCHitN)auVar196[0xd];
              local_2c0[0xe] = (RTCHitN)auVar196[0xe];
              local_2c0[0xf] = (RTCHitN)auVar196[0xf];
              local_2c0[0x10] = (RTCHitN)auVar196[0x10];
              local_2c0[0x11] = (RTCHitN)auVar196[0x11];
              local_2c0[0x12] = (RTCHitN)auVar196[0x12];
              local_2c0[0x13] = (RTCHitN)auVar196[0x13];
              local_2c0[0x14] = (RTCHitN)auVar196[0x14];
              local_2c0[0x15] = (RTCHitN)auVar196[0x15];
              local_2c0[0x16] = (RTCHitN)auVar196[0x16];
              local_2c0[0x17] = (RTCHitN)auVar196[0x17];
              local_2c0[0x18] = (RTCHitN)auVar196[0x18];
              local_2c0[0x19] = (RTCHitN)auVar196[0x19];
              local_2c0[0x1a] = (RTCHitN)auVar196[0x1a];
              local_2c0[0x1b] = (RTCHitN)auVar196[0x1b];
              local_2c0[0x1c] = (RTCHitN)auVar196[0x1c];
              local_2c0[0x1d] = (RTCHitN)auVar196[0x1d];
              local_2c0[0x1e] = (RTCHitN)auVar196[0x1e];
              local_2c0[0x1f] = (RTCHitN)auVar196[0x1f];
              local_2c0[0x20] = (RTCHitN)auVar196[0x20];
              local_2c0[0x21] = (RTCHitN)auVar196[0x21];
              local_2c0[0x22] = (RTCHitN)auVar196[0x22];
              local_2c0[0x23] = (RTCHitN)auVar196[0x23];
              local_2c0[0x24] = (RTCHitN)auVar196[0x24];
              local_2c0[0x25] = (RTCHitN)auVar196[0x25];
              local_2c0[0x26] = (RTCHitN)auVar196[0x26];
              local_2c0[0x27] = (RTCHitN)auVar196[0x27];
              local_2c0[0x28] = (RTCHitN)auVar196[0x28];
              local_2c0[0x29] = (RTCHitN)auVar196[0x29];
              local_2c0[0x2a] = (RTCHitN)auVar196[0x2a];
              local_2c0[0x2b] = (RTCHitN)auVar196[0x2b];
              local_2c0[0x2c] = (RTCHitN)auVar196[0x2c];
              local_2c0[0x2d] = (RTCHitN)auVar196[0x2d];
              local_2c0[0x2e] = (RTCHitN)auVar196[0x2e];
              local_2c0[0x2f] = (RTCHitN)auVar196[0x2f];
              local_2c0[0x30] = (RTCHitN)auVar196[0x30];
              local_2c0[0x31] = (RTCHitN)auVar196[0x31];
              local_2c0[0x32] = (RTCHitN)auVar196[0x32];
              local_2c0[0x33] = (RTCHitN)auVar196[0x33];
              local_2c0[0x34] = (RTCHitN)auVar196[0x34];
              local_2c0[0x35] = (RTCHitN)auVar196[0x35];
              local_2c0[0x36] = (RTCHitN)auVar196[0x36];
              local_2c0[0x37] = (RTCHitN)auVar196[0x37];
              local_2c0[0x38] = (RTCHitN)auVar196[0x38];
              local_2c0[0x39] = (RTCHitN)auVar196[0x39];
              local_2c0[0x3a] = (RTCHitN)auVar196[0x3a];
              local_2c0[0x3b] = (RTCHitN)auVar196[0x3b];
              local_2c0[0x3c] = (RTCHitN)auVar196[0x3c];
              local_2c0[0x3d] = (RTCHitN)auVar196[0x3d];
              local_2c0[0x3e] = (RTCHitN)auVar196[0x3e];
              local_2c0[0x3f] = (RTCHitN)auVar196[0x3f];
              local_140 = vmovdqa64_avx512f(auVar195);
              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
              *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar102);
              local_6c0 = vmovdqa64_avx512f(auVar164);
              local_810.geometryUserPtr = pGVar10->userPtr;
              local_810.context = context->user;
              local_810.N = 0x10;
              auVar195 = vmovdqa64_avx512f(auVar164);
              local_7a0 = auVar172._0_32_;
              local_7c0 = auVar185._0_32_;
              local_640 = vmovdqa64_avx512f(auVar164);
              local_7e0 = auVar95;
              local_810.ray = (RTCRayN *)ray;
              if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar108 = ZEXT1632(auVar194._0_16_);
                (*pGVar10->intersectionFilterN)(&local_810);
                auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
                auVar194 = ZEXT3264(auVar108);
                auVar164 = vmovdqa64_avx512f(local_640);
                auVar185 = ZEXT3264(local_7c0);
                auVar172 = ZEXT3264(local_7a0);
                auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar193 = ZEXT3264(auVar108);
                auVar195 = vmovdqa64_avx512f(local_6c0);
                auVar95 = local_7e0;
              }
              uVar70 = vptestmd_avx512f(auVar195,auVar195);
              if ((short)uVar70 == 0) {
LAB_01c56748:
                *(int *)(ray + k * 4 + 0x200) = auVar185._0_4_;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar108 = ZEXT1632(auVar194._0_16_);
                  (*p_Var12)(&local_810);
                  auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
                  auVar194 = ZEXT3264(auVar108);
                  auVar164 = vmovdqa64_avx512f(local_640);
                  auVar185 = ZEXT3264(local_7c0);
                  auVar172 = ZEXT3264(local_7a0);
                  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar193 = ZEXT3264(auVar108);
                  auVar195 = vmovdqa64_avx512f(local_6c0);
                  auVar95 = local_7e0;
                }
                uVar102 = vptestmd_avx512f(auVar195,auVar195);
                if ((short)uVar102 == 0) goto LAB_01c56748;
                iVar103 = *(int *)(local_810.hit + 4);
                iVar140 = *(int *)(local_810.hit + 8);
                iVar141 = *(int *)(local_810.hit + 0xc);
                iVar142 = *(int *)(local_810.hit + 0x10);
                iVar143 = *(int *)(local_810.hit + 0x14);
                iVar144 = *(int *)(local_810.hit + 0x18);
                iVar145 = *(int *)(local_810.hit + 0x1c);
                iVar146 = *(int *)(local_810.hit + 0x20);
                iVar84 = *(int *)(local_810.hit + 0x24);
                iVar85 = *(int *)(local_810.hit + 0x28);
                iVar86 = *(int *)(local_810.hit + 0x2c);
                iVar87 = *(int *)(local_810.hit + 0x30);
                iVar88 = *(int *)(local_810.hit + 0x34);
                iVar89 = *(int *)(local_810.hit + 0x38);
                iVar90 = *(int *)(local_810.hit + 0x3c);
                bVar92 = (byte)uVar102;
                bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar102 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar102 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar102 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                bVar19 = (bool)((byte)(uVar102 >> 7) & 1);
                bVar100 = (byte)(uVar102 >> 8);
                bVar20 = (bool)((byte)(uVar102 >> 9) & 1);
                bVar21 = (bool)((byte)(uVar102 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar102 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar102 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar102 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar102 >> 0xe) & 1);
                bVar39 = SUB81(uVar102 >> 0xf,0);
                *(uint *)(local_810.ray + 0x300) =
                     (uint)(bVar92 & 1) * *(int *)local_810.hit |
                     (uint)!(bool)(bVar92 & 1) * *(int *)(local_810.ray + 0x300);
                *(uint *)(local_810.ray + 0x304) =
                     (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x304);
                *(uint *)(local_810.ray + 0x308) =
                     (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x308);
                *(uint *)(local_810.ray + 0x30c) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x30c);
                *(uint *)(local_810.ray + 0x310) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x310);
                *(uint *)(local_810.ray + 0x314) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x314);
                *(uint *)(local_810.ray + 0x318) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x318);
                *(uint *)(local_810.ray + 0x31c) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x31c);
                *(uint *)(local_810.ray + 800) =
                     (uint)(bVar100 & 1) * iVar146 |
                     (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 800);
                *(uint *)(local_810.ray + 0x324) =
                     (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x324);
                *(uint *)(local_810.ray + 0x328) =
                     (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x328);
                *(uint *)(local_810.ray + 0x32c) =
                     (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x32c);
                *(uint *)(local_810.ray + 0x330) =
                     (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x330);
                *(uint *)(local_810.ray + 0x334) =
                     (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x334);
                *(uint *)(local_810.ray + 0x338) =
                     (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x338);
                *(uint *)(local_810.ray + 0x33c) =
                     (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x33c);
                iVar103 = *(int *)(local_810.hit + 0x44);
                iVar140 = *(int *)(local_810.hit + 0x48);
                iVar141 = *(int *)(local_810.hit + 0x4c);
                iVar142 = *(int *)(local_810.hit + 0x50);
                iVar143 = *(int *)(local_810.hit + 0x54);
                iVar144 = *(int *)(local_810.hit + 0x58);
                iVar145 = *(int *)(local_810.hit + 0x5c);
                iVar146 = *(int *)(local_810.hit + 0x60);
                iVar84 = *(int *)(local_810.hit + 100);
                iVar85 = *(int *)(local_810.hit + 0x68);
                iVar86 = *(int *)(local_810.hit + 0x6c);
                iVar87 = *(int *)(local_810.hit + 0x70);
                iVar88 = *(int *)(local_810.hit + 0x74);
                iVar89 = *(int *)(local_810.hit + 0x78);
                iVar90 = *(int *)(local_810.hit + 0x7c);
                bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar102 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar102 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar102 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                bVar19 = (bool)((byte)(uVar102 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar102 >> 9) & 1);
                bVar21 = (bool)((byte)(uVar102 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar102 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar102 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar102 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar102 >> 0xe) & 1);
                bVar39 = SUB81(uVar102 >> 0xf,0);
                *(uint *)(local_810.ray + 0x340) =
                     (uint)(bVar92 & 1) * *(int *)(local_810.hit + 0x40) |
                     (uint)!(bool)(bVar92 & 1) * *(int *)(local_810.ray + 0x340);
                *(uint *)(local_810.ray + 0x344) =
                     (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x344);
                *(uint *)(local_810.ray + 0x348) =
                     (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x348);
                *(uint *)(local_810.ray + 0x34c) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x34c);
                *(uint *)(local_810.ray + 0x350) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x350);
                *(uint *)(local_810.ray + 0x354) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x354);
                *(uint *)(local_810.ray + 0x358) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x358);
                *(uint *)(local_810.ray + 0x35c) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x35c);
                *(uint *)(local_810.ray + 0x360) =
                     (uint)(bVar100 & 1) * iVar146 |
                     (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x360);
                *(uint *)(local_810.ray + 0x364) =
                     (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x364);
                *(uint *)(local_810.ray + 0x368) =
                     (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x368);
                *(uint *)(local_810.ray + 0x36c) =
                     (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x36c);
                *(uint *)(local_810.ray + 0x370) =
                     (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x370);
                *(uint *)(local_810.ray + 0x374) =
                     (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x374);
                *(uint *)(local_810.ray + 0x378) =
                     (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x378);
                *(uint *)(local_810.ray + 0x37c) =
                     (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x37c);
                iVar103 = *(int *)(local_810.hit + 0x84);
                iVar140 = *(int *)(local_810.hit + 0x88);
                iVar141 = *(int *)(local_810.hit + 0x8c);
                iVar142 = *(int *)(local_810.hit + 0x90);
                iVar143 = *(int *)(local_810.hit + 0x94);
                iVar144 = *(int *)(local_810.hit + 0x98);
                iVar145 = *(int *)(local_810.hit + 0x9c);
                iVar146 = *(int *)(local_810.hit + 0xa0);
                iVar84 = *(int *)(local_810.hit + 0xa4);
                iVar85 = *(int *)(local_810.hit + 0xa8);
                iVar86 = *(int *)(local_810.hit + 0xac);
                iVar87 = *(int *)(local_810.hit + 0xb0);
                iVar88 = *(int *)(local_810.hit + 0xb4);
                iVar89 = *(int *)(local_810.hit + 0xb8);
                iVar90 = *(int *)(local_810.hit + 0xbc);
                bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar102 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar102 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar102 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                bVar19 = (bool)((byte)(uVar102 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar102 >> 9) & 1);
                bVar21 = (bool)((byte)(uVar102 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar102 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar102 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar102 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar102 >> 0xe) & 1);
                bVar39 = SUB81(uVar102 >> 0xf,0);
                *(uint *)(local_810.ray + 0x380) =
                     (uint)(bVar92 & 1) * *(int *)(local_810.hit + 0x80) |
                     (uint)!(bool)(bVar92 & 1) * *(int *)(local_810.ray + 0x380);
                *(uint *)(local_810.ray + 900) =
                     (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 900);
                *(uint *)(local_810.ray + 0x388) =
                     (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x388);
                *(uint *)(local_810.ray + 0x38c) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x38c);
                *(uint *)(local_810.ray + 0x390) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x390);
                *(uint *)(local_810.ray + 0x394) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x394);
                *(uint *)(local_810.ray + 0x398) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x398);
                *(uint *)(local_810.ray + 0x39c) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x39c);
                *(uint *)(local_810.ray + 0x3a0) =
                     (uint)(bVar100 & 1) * iVar146 |
                     (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x3a0);
                *(uint *)(local_810.ray + 0x3a4) =
                     (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3a4);
                *(uint *)(local_810.ray + 0x3a8) =
                     (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3a8);
                *(uint *)(local_810.ray + 0x3ac) =
                     (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x3ac);
                *(uint *)(local_810.ray + 0x3b0) =
                     (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x3b0);
                *(uint *)(local_810.ray + 0x3b4) =
                     (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x3b4);
                *(uint *)(local_810.ray + 0x3b8) =
                     (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x3b8);
                *(uint *)(local_810.ray + 0x3bc) =
                     (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x3bc);
                iVar103 = *(int *)(local_810.hit + 0xc4);
                iVar140 = *(int *)(local_810.hit + 200);
                iVar141 = *(int *)(local_810.hit + 0xcc);
                iVar142 = *(int *)(local_810.hit + 0xd0);
                iVar143 = *(int *)(local_810.hit + 0xd4);
                iVar144 = *(int *)(local_810.hit + 0xd8);
                iVar145 = *(int *)(local_810.hit + 0xdc);
                iVar146 = *(int *)(local_810.hit + 0xe0);
                iVar84 = *(int *)(local_810.hit + 0xe4);
                iVar85 = *(int *)(local_810.hit + 0xe8);
                iVar86 = *(int *)(local_810.hit + 0xec);
                iVar87 = *(int *)(local_810.hit + 0xf0);
                iVar88 = *(int *)(local_810.hit + 0xf4);
                iVar89 = *(int *)(local_810.hit + 0xf8);
                iVar90 = *(int *)(local_810.hit + 0xfc);
                bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar102 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar102 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar102 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                bVar19 = (bool)((byte)(uVar102 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar102 >> 9) & 1);
                bVar21 = (bool)((byte)(uVar102 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar102 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar102 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar102 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar102 >> 0xe) & 1);
                bVar39 = SUB81(uVar102 >> 0xf,0);
                *(uint *)(local_810.ray + 0x3c0) =
                     (uint)(bVar92 & 1) * *(int *)(local_810.hit + 0xc0) |
                     (uint)!(bool)(bVar92 & 1) * *(int *)(local_810.ray + 0x3c0);
                *(uint *)(local_810.ray + 0x3c4) =
                     (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x3c4);
                *(uint *)(local_810.ray + 0x3c8) =
                     (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x3c8);
                *(uint *)(local_810.ray + 0x3cc) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x3cc);
                *(uint *)(local_810.ray + 0x3d0) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x3d0);
                *(uint *)(local_810.ray + 0x3d4) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x3d4);
                *(uint *)(local_810.ray + 0x3d8) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x3d8);
                *(uint *)(local_810.ray + 0x3dc) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x3dc);
                *(uint *)(local_810.ray + 0x3e0) =
                     (uint)(bVar100 & 1) * iVar146 |
                     (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x3e0);
                *(uint *)(local_810.ray + 0x3e4) =
                     (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3e4);
                *(uint *)(local_810.ray + 1000) =
                     (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 1000);
                *(uint *)(local_810.ray + 0x3ec) =
                     (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x3ec);
                *(uint *)(local_810.ray + 0x3f0) =
                     (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x3f0);
                *(uint *)(local_810.ray + 0x3f4) =
                     (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x3f4);
                *(uint *)(local_810.ray + 0x3f8) =
                     (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x3f8);
                *(uint *)(local_810.ray + 0x3fc) =
                     (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x3fc);
                iVar103 = *(int *)(local_810.hit + 0x104);
                iVar140 = *(int *)(local_810.hit + 0x108);
                iVar141 = *(int *)(local_810.hit + 0x10c);
                iVar142 = *(int *)(local_810.hit + 0x110);
                iVar143 = *(int *)(local_810.hit + 0x114);
                iVar144 = *(int *)(local_810.hit + 0x118);
                iVar145 = *(int *)(local_810.hit + 0x11c);
                iVar146 = *(int *)(local_810.hit + 0x120);
                iVar84 = *(int *)(local_810.hit + 0x124);
                iVar85 = *(int *)(local_810.hit + 0x128);
                iVar86 = *(int *)(local_810.hit + 300);
                iVar87 = *(int *)(local_810.hit + 0x130);
                iVar88 = *(int *)(local_810.hit + 0x134);
                iVar89 = *(int *)(local_810.hit + 0x138);
                iVar90 = *(int *)(local_810.hit + 0x13c);
                bVar13 = (bool)((byte)(uVar102 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar102 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar102 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar102 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                bVar19 = (bool)((byte)(uVar102 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar102 >> 9) & 1);
                bVar21 = (bool)((byte)(uVar102 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar102 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar102 >> 0xc) & 1);
                bVar31 = (bool)((byte)(uVar102 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar102 >> 0xe) & 1);
                bVar39 = SUB81(uVar102 >> 0xf,0);
                *(uint *)(local_810.ray + 0x400) =
                     (uint)(bVar92 & 1) * *(int *)(local_810.hit + 0x100) |
                     (uint)!(bool)(bVar92 & 1) * *(int *)(local_810.ray + 0x400);
                *(uint *)(local_810.ray + 0x404) =
                     (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x404);
                *(uint *)(local_810.ray + 0x408) =
                     (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x408);
                *(uint *)(local_810.ray + 0x40c) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x40c);
                *(uint *)(local_810.ray + 0x410) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x410);
                *(uint *)(local_810.ray + 0x414) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x414);
                *(uint *)(local_810.ray + 0x418) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x418);
                *(uint *)(local_810.ray + 0x41c) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x41c);
                *(uint *)(local_810.ray + 0x420) =
                     (uint)(bVar100 & 1) * iVar146 |
                     (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x420);
                *(uint *)(local_810.ray + 0x424) =
                     (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x424);
                *(uint *)(local_810.ray + 0x428) =
                     (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x428);
                *(uint *)(local_810.ray + 0x42c) =
                     (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x42c);
                *(uint *)(local_810.ray + 0x430) =
                     (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x430);
                *(uint *)(local_810.ray + 0x434) =
                     (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x434);
                *(uint *)(local_810.ray + 0x438) =
                     (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x438);
                *(uint *)(local_810.ray + 0x43c) =
                     (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x43c);
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x140));
                auVar195 = vmovdqu32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_810.ray + 0x440) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x180));
                auVar195 = vmovdqu32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_810.ray + 0x480) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x1c0));
                auVar195 = vmovdqa32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_810.ray + 0x4c0) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x200));
                auVar195 = vmovdqa32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_810.ray + 0x500) = auVar195;
                auVar185 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
              }
              uVar183 = auVar185._0_4_;
              auVar137._4_4_ = uVar183;
              auVar137._0_4_ = uVar183;
              auVar137._8_4_ = uVar183;
              auVar137._12_4_ = uVar183;
              auVar137._16_4_ = uVar183;
              auVar137._20_4_ = uVar183;
              auVar137._24_4_ = uVar183;
              auVar137._28_4_ = uVar183;
              uVar70 = vcmpps_avx512vl(auVar172._0_32_,auVar137,2);
              uVar98 = (uint)(byte)(~(byte)(1 << (uVar93 & 0x1f)) & (byte)uVar98) & (uint)uVar70;
            }
            bVar92 = (byte)uVar98;
            if (bVar92 == 0) {
              return;
            }
            auVar108 = vblendmps_avx512vl(auVar193._0_32_,auVar172._0_32_);
            auVar138._0_4_ =
                 (uint)(bVar92 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar137._0_4_;
            bVar13 = (bool)((byte)(uVar98 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar137._4_4_;
            bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar137._8_4_;
            bVar13 = (bool)((byte)(uVar98 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar137._12_4_;
            bVar13 = (bool)((byte)(uVar98 >> 4) & 1);
            auVar138._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar137._16_4_;
            bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
            auVar138._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar137._20_4_;
            bVar13 = (bool)((byte)(uVar98 >> 6) & 1);
            auVar138._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar137._24_4_;
            auVar138._28_4_ =
                 (uVar98 >> 7) * auVar108._28_4_ | (uint)!SUB41(uVar98 >> 7,0) * auVar137._28_4_;
            auVar108 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar108 = vminps_avx(auVar138,auVar108);
            auVar109 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar109);
            auVar109 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar109);
            uVar70 = vcmpps_avx512vl(auVar138,auVar108,0);
            bVar92 = (byte)uVar70 & bVar92;
            uVar94 = uVar98;
            if (bVar92 != 0) {
              uVar94 = (uint)bVar92;
            }
            uVar93 = 0;
            for (; auVar137 = auVar138, (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
              uVar93 = uVar93 + 1;
            }
          } while( true );
        }
        local_3a0 = auVar157._0_32_;
        local_380 = auVar108;
        uVar102 = (ulong)(uVar96 * 4);
        local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_780 + uVar102)));
        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_760 + uVar102)));
        auVar157 = vpbroadcastd_avx512f();
        local_180 = vbroadcastss_avx512f
                              (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar102)));
        auVar161 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_720 + uVar102)));
        local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_700 + uVar102)));
        local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6e0 + uVar102)));
        local_2c0[0] = (RTCHitN)auVar161[0];
        local_2c0[1] = (RTCHitN)auVar161[1];
        local_2c0[2] = (RTCHitN)auVar161[2];
        local_2c0[3] = (RTCHitN)auVar161[3];
        local_2c0[4] = (RTCHitN)auVar161[4];
        local_2c0[5] = (RTCHitN)auVar161[5];
        local_2c0[6] = (RTCHitN)auVar161[6];
        local_2c0[7] = (RTCHitN)auVar161[7];
        local_2c0[8] = (RTCHitN)auVar161[8];
        local_2c0[9] = (RTCHitN)auVar161[9];
        local_2c0[10] = (RTCHitN)auVar161[10];
        local_2c0[0xb] = (RTCHitN)auVar161[0xb];
        local_2c0[0xc] = (RTCHitN)auVar161[0xc];
        local_2c0[0xd] = (RTCHitN)auVar161[0xd];
        local_2c0[0xe] = (RTCHitN)auVar161[0xe];
        local_2c0[0xf] = (RTCHitN)auVar161[0xf];
        local_2c0[0x10] = (RTCHitN)auVar161[0x10];
        local_2c0[0x11] = (RTCHitN)auVar161[0x11];
        local_2c0[0x12] = (RTCHitN)auVar161[0x12];
        local_2c0[0x13] = (RTCHitN)auVar161[0x13];
        local_2c0[0x14] = (RTCHitN)auVar161[0x14];
        local_2c0[0x15] = (RTCHitN)auVar161[0x15];
        local_2c0[0x16] = (RTCHitN)auVar161[0x16];
        local_2c0[0x17] = (RTCHitN)auVar161[0x17];
        local_2c0[0x18] = (RTCHitN)auVar161[0x18];
        local_2c0[0x19] = (RTCHitN)auVar161[0x19];
        local_2c0[0x1a] = (RTCHitN)auVar161[0x1a];
        local_2c0[0x1b] = (RTCHitN)auVar161[0x1b];
        local_2c0[0x1c] = (RTCHitN)auVar161[0x1c];
        local_2c0[0x1d] = (RTCHitN)auVar161[0x1d];
        local_2c0[0x1e] = (RTCHitN)auVar161[0x1e];
        local_2c0[0x1f] = (RTCHitN)auVar161[0x1f];
        local_2c0[0x20] = (RTCHitN)auVar161[0x20];
        local_2c0[0x21] = (RTCHitN)auVar161[0x21];
        local_2c0[0x22] = (RTCHitN)auVar161[0x22];
        local_2c0[0x23] = (RTCHitN)auVar161[0x23];
        local_2c0[0x24] = (RTCHitN)auVar161[0x24];
        local_2c0[0x25] = (RTCHitN)auVar161[0x25];
        local_2c0[0x26] = (RTCHitN)auVar161[0x26];
        local_2c0[0x27] = (RTCHitN)auVar161[0x27];
        local_2c0[0x28] = (RTCHitN)auVar161[0x28];
        local_2c0[0x29] = (RTCHitN)auVar161[0x29];
        local_2c0[0x2a] = (RTCHitN)auVar161[0x2a];
        local_2c0[0x2b] = (RTCHitN)auVar161[0x2b];
        local_2c0[0x2c] = (RTCHitN)auVar161[0x2c];
        local_2c0[0x2d] = (RTCHitN)auVar161[0x2d];
        local_2c0[0x2e] = (RTCHitN)auVar161[0x2e];
        local_2c0[0x2f] = (RTCHitN)auVar161[0x2f];
        local_2c0[0x30] = (RTCHitN)auVar161[0x30];
        local_2c0[0x31] = (RTCHitN)auVar161[0x31];
        local_2c0[0x32] = (RTCHitN)auVar161[0x32];
        local_2c0[0x33] = (RTCHitN)auVar161[0x33];
        local_2c0[0x34] = (RTCHitN)auVar161[0x34];
        local_2c0[0x35] = (RTCHitN)auVar161[0x35];
        local_2c0[0x36] = (RTCHitN)auVar161[0x36];
        local_2c0[0x37] = (RTCHitN)auVar161[0x37];
        local_2c0[0x38] = (RTCHitN)auVar161[0x38];
        local_2c0[0x39] = (RTCHitN)auVar161[0x39];
        local_2c0[0x3a] = (RTCHitN)auVar161[0x3a];
        local_2c0[0x3b] = (RTCHitN)auVar161[0x3b];
        local_2c0[0x3c] = (RTCHitN)auVar161[0x3c];
        local_2c0[0x3d] = (RTCHitN)auVar161[0x3d];
        local_2c0[0x3e] = (RTCHitN)auVar161[0x3e];
        local_2c0[0x3f] = (RTCHitN)auVar161[0x3f];
        local_140 = vmovdqa64_avx512f(auVar157);
        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
        *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar102);
        local_6c0 = vmovdqa64_avx512f(auVar164);
        local_810.geometryUserPtr = pGVar10->userPtr;
        local_810.context = context->user;
        local_810.N = 0x10;
        auVar139 = vmovdqa64_avx512f(auVar164);
        local_7a0 = auVar172._0_32_;
        local_3c0 = auVar105;
        local_3e0 = auVar107;
        local_400 = auVar111;
        local_420 = auVar112;
        local_440 = auVar113;
        local_460 = auVar116;
        local_7c0 = auVar185._0_32_;
        local_480 = auVar119;
        local_4a0 = auVar121;
        local_4c0 = auVar160;
        local_640 = vmovdqa64_avx512f(auVar164);
        local_4e0 = auVar120;
        local_500 = auVar162;
        local_520 = auVar136;
        local_540 = auVar114;
        local_560 = auVar115;
        local_580 = auVar118;
        local_5a0 = auVar129;
        local_5c0 = auVar158;
        local_5e0 = auVar117;
        local_600 = auVar110;
        uVar102 = uVar101;
        if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
          auVar167 = ZEXT1664(auVar167._0_16_);
          auVar108 = ZEXT1632(auVar182._0_16_);
          (*pGVar10->intersectionFilterN)(&local_810);
          auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
          auVar182 = ZEXT3264(auVar108);
          auVar169 = ZEXT3264(local_600);
          auVar200 = ZEXT3264(local_5e0);
          auVar190 = ZEXT3264(local_5c0);
          auVar189 = ZEXT3264(local_5a0);
          uVar102 = uVar101 & 0xffff;
          auVar180 = ZEXT3264(local_580);
          auVar188 = ZEXT3264(local_560);
          auVar187 = ZEXT3264(local_540);
          auVar186 = ZEXT3264(local_520);
          auVar192 = ZEXT3264(local_500);
          auVar202 = ZEXT3264(local_4e0);
          auVar164 = vmovdqa64_avx512f(local_640);
          auVar191 = ZEXT3264(local_4c0);
          auVar203 = ZEXT3264(local_4a0);
          auVar201 = ZEXT3264(local_480);
          auVar185 = ZEXT3264(local_7c0);
          auVar199 = ZEXT3264(local_460);
          auVar198 = ZEXT3264(local_440);
          auVar197 = ZEXT3264(local_420);
          auVar196 = ZEXT3264(local_400);
          auVar195 = ZEXT3264(local_3e0);
          auVar194 = ZEXT3264(local_3c0);
          auVar172 = ZEXT3264(local_7a0);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar193 = ZEXT3264(auVar108);
          auVar139 = vmovdqa64_avx512f(local_6c0);
        }
        uVar70 = vptestmd_avx512f(auVar139,auVar139);
        auVar161 = ZEXT3264(local_380);
        auVar157 = ZEXT3264(local_3a0);
        if ((short)uVar70 == 0) {
LAB_01c561b1:
          *(int *)(ray + k * 4 + 0x200) = auVar185._0_4_;
        }
        else {
          p_Var12 = context->args->filter;
          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
            auVar167 = ZEXT1664(auVar167._0_16_);
            auVar108 = ZEXT1632(auVar182._0_16_);
            (*p_Var12)(&local_810);
            auVar108 = vpcmpeqd_avx2(auVar108,auVar108);
            auVar182 = ZEXT3264(auVar108);
            auVar157 = ZEXT3264(local_3a0);
            auVar161 = ZEXT3264(local_380);
            auVar169 = ZEXT3264(local_600);
            auVar200 = ZEXT3264(local_5e0);
            auVar190 = ZEXT3264(local_5c0);
            auVar189 = ZEXT3264(local_5a0);
            uVar102 = uVar101 & 0xffff;
            auVar180 = ZEXT3264(local_580);
            auVar188 = ZEXT3264(local_560);
            auVar187 = ZEXT3264(local_540);
            auVar186 = ZEXT3264(local_520);
            auVar192 = ZEXT3264(local_500);
            auVar202 = ZEXT3264(local_4e0);
            auVar164 = vmovdqa64_avx512f(local_640);
            auVar191 = ZEXT3264(local_4c0);
            auVar203 = ZEXT3264(local_4a0);
            auVar201 = ZEXT3264(local_480);
            auVar185 = ZEXT3264(local_7c0);
            auVar199 = ZEXT3264(local_460);
            auVar198 = ZEXT3264(local_440);
            auVar197 = ZEXT3264(local_420);
            auVar196 = ZEXT3264(local_400);
            auVar195 = ZEXT3264(local_3e0);
            auVar194 = ZEXT3264(local_3c0);
            auVar172 = ZEXT3264(local_7a0);
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar193 = ZEXT3264(auVar108);
            auVar139 = vmovdqa64_avx512f(local_6c0);
          }
          uVar75 = vptestmd_avx512f(auVar139,auVar139);
          if ((short)uVar75 == 0) goto LAB_01c561b1;
          iVar103 = *(int *)(local_810.hit + 4);
          iVar140 = *(int *)(local_810.hit + 8);
          iVar141 = *(int *)(local_810.hit + 0xc);
          iVar142 = *(int *)(local_810.hit + 0x10);
          iVar143 = *(int *)(local_810.hit + 0x14);
          iVar144 = *(int *)(local_810.hit + 0x18);
          iVar145 = *(int *)(local_810.hit + 0x1c);
          iVar146 = *(int *)(local_810.hit + 0x20);
          iVar84 = *(int *)(local_810.hit + 0x24);
          iVar85 = *(int *)(local_810.hit + 0x28);
          iVar86 = *(int *)(local_810.hit + 0x2c);
          iVar87 = *(int *)(local_810.hit + 0x30);
          iVar88 = *(int *)(local_810.hit + 0x34);
          iVar89 = *(int *)(local_810.hit + 0x38);
          iVar90 = *(int *)(local_810.hit + 0x3c);
          bVar100 = (byte)uVar75;
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar75 >> 7) & 1);
          bVar91 = (byte)(uVar75 >> 8);
          bVar20 = (bool)((byte)(uVar75 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar75 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar75 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar75 >> 0xc) & 1);
          bVar31 = (bool)((byte)(uVar75 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar75 >> 0xe) & 1);
          bVar39 = SUB81(uVar75 >> 0xf,0);
          *(uint *)(local_810.ray + 0x300) =
               (uint)(bVar100 & 1) * *(int *)local_810.hit |
               (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x300);
          *(uint *)(local_810.ray + 0x304) =
               (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x304);
          *(uint *)(local_810.ray + 0x308) =
               (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x308);
          *(uint *)(local_810.ray + 0x30c) =
               (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x30c);
          *(uint *)(local_810.ray + 0x310) =
               (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x310);
          *(uint *)(local_810.ray + 0x314) =
               (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x314);
          *(uint *)(local_810.ray + 0x318) =
               (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x318);
          *(uint *)(local_810.ray + 0x31c) =
               (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x31c);
          *(uint *)(local_810.ray + 800) =
               (uint)(bVar91 & 1) * iVar146 |
               (uint)!(bool)(bVar91 & 1) * *(int *)(local_810.ray + 800);
          *(uint *)(local_810.ray + 0x324) =
               (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x324);
          *(uint *)(local_810.ray + 0x328) =
               (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x328);
          *(uint *)(local_810.ray + 0x32c) =
               (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x32c);
          *(uint *)(local_810.ray + 0x330) =
               (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x330);
          *(uint *)(local_810.ray + 0x334) =
               (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x334);
          *(uint *)(local_810.ray + 0x338) =
               (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x338);
          *(uint *)(local_810.ray + 0x33c) =
               (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x33c);
          iVar103 = *(int *)(local_810.hit + 0x44);
          iVar140 = *(int *)(local_810.hit + 0x48);
          iVar141 = *(int *)(local_810.hit + 0x4c);
          iVar142 = *(int *)(local_810.hit + 0x50);
          iVar143 = *(int *)(local_810.hit + 0x54);
          iVar144 = *(int *)(local_810.hit + 0x58);
          iVar145 = *(int *)(local_810.hit + 0x5c);
          iVar146 = *(int *)(local_810.hit + 0x60);
          iVar84 = *(int *)(local_810.hit + 100);
          iVar85 = *(int *)(local_810.hit + 0x68);
          iVar86 = *(int *)(local_810.hit + 0x6c);
          iVar87 = *(int *)(local_810.hit + 0x70);
          iVar88 = *(int *)(local_810.hit + 0x74);
          iVar89 = *(int *)(local_810.hit + 0x78);
          iVar90 = *(int *)(local_810.hit + 0x7c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar75 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar75 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar75 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar75 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar75 >> 0xc) & 1);
          bVar31 = (bool)((byte)(uVar75 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar75 >> 0xe) & 1);
          bVar39 = SUB81(uVar75 >> 0xf,0);
          *(uint *)(local_810.ray + 0x340) =
               (uint)(bVar100 & 1) * *(int *)(local_810.hit + 0x40) |
               (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x340);
          *(uint *)(local_810.ray + 0x344) =
               (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x344);
          *(uint *)(local_810.ray + 0x348) =
               (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x348);
          *(uint *)(local_810.ray + 0x34c) =
               (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x34c);
          *(uint *)(local_810.ray + 0x350) =
               (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x350);
          *(uint *)(local_810.ray + 0x354) =
               (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x354);
          *(uint *)(local_810.ray + 0x358) =
               (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x358);
          *(uint *)(local_810.ray + 0x35c) =
               (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x35c);
          *(uint *)(local_810.ray + 0x360) =
               (uint)(bVar91 & 1) * iVar146 |
               (uint)!(bool)(bVar91 & 1) * *(int *)(local_810.ray + 0x360);
          *(uint *)(local_810.ray + 0x364) =
               (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x364);
          *(uint *)(local_810.ray + 0x368) =
               (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x368);
          *(uint *)(local_810.ray + 0x36c) =
               (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x36c);
          *(uint *)(local_810.ray + 0x370) =
               (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x370);
          *(uint *)(local_810.ray + 0x374) =
               (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x374);
          *(uint *)(local_810.ray + 0x378) =
               (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x378);
          *(uint *)(local_810.ray + 0x37c) =
               (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x37c);
          iVar103 = *(int *)(local_810.hit + 0x84);
          iVar140 = *(int *)(local_810.hit + 0x88);
          iVar141 = *(int *)(local_810.hit + 0x8c);
          iVar142 = *(int *)(local_810.hit + 0x90);
          iVar143 = *(int *)(local_810.hit + 0x94);
          iVar144 = *(int *)(local_810.hit + 0x98);
          iVar145 = *(int *)(local_810.hit + 0x9c);
          iVar146 = *(int *)(local_810.hit + 0xa0);
          iVar84 = *(int *)(local_810.hit + 0xa4);
          iVar85 = *(int *)(local_810.hit + 0xa8);
          iVar86 = *(int *)(local_810.hit + 0xac);
          iVar87 = *(int *)(local_810.hit + 0xb0);
          iVar88 = *(int *)(local_810.hit + 0xb4);
          iVar89 = *(int *)(local_810.hit + 0xb8);
          iVar90 = *(int *)(local_810.hit + 0xbc);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar75 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar75 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar75 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar75 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar75 >> 0xc) & 1);
          bVar31 = (bool)((byte)(uVar75 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar75 >> 0xe) & 1);
          bVar39 = SUB81(uVar75 >> 0xf,0);
          *(uint *)(local_810.ray + 0x380) =
               (uint)(bVar100 & 1) * *(int *)(local_810.hit + 0x80) |
               (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x380);
          *(uint *)(local_810.ray + 900) =
               (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 900);
          *(uint *)(local_810.ray + 0x388) =
               (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x388);
          *(uint *)(local_810.ray + 0x38c) =
               (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x38c);
          *(uint *)(local_810.ray + 0x390) =
               (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x390);
          *(uint *)(local_810.ray + 0x394) =
               (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x394);
          *(uint *)(local_810.ray + 0x398) =
               (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x398);
          *(uint *)(local_810.ray + 0x39c) =
               (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x39c);
          *(uint *)(local_810.ray + 0x3a0) =
               (uint)(bVar91 & 1) * iVar146 |
               (uint)!(bool)(bVar91 & 1) * *(int *)(local_810.ray + 0x3a0);
          *(uint *)(local_810.ray + 0x3a4) =
               (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3a4);
          *(uint *)(local_810.ray + 0x3a8) =
               (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x3a8);
          *(uint *)(local_810.ray + 0x3ac) =
               (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x3ac);
          *(uint *)(local_810.ray + 0x3b0) =
               (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x3b0);
          *(uint *)(local_810.ray + 0x3b4) =
               (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x3b4);
          *(uint *)(local_810.ray + 0x3b8) =
               (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x3b8);
          *(uint *)(local_810.ray + 0x3bc) =
               (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x3bc);
          iVar103 = *(int *)(local_810.hit + 0xc4);
          iVar140 = *(int *)(local_810.hit + 200);
          iVar141 = *(int *)(local_810.hit + 0xcc);
          iVar142 = *(int *)(local_810.hit + 0xd0);
          iVar143 = *(int *)(local_810.hit + 0xd4);
          iVar144 = *(int *)(local_810.hit + 0xd8);
          iVar145 = *(int *)(local_810.hit + 0xdc);
          iVar146 = *(int *)(local_810.hit + 0xe0);
          iVar84 = *(int *)(local_810.hit + 0xe4);
          iVar85 = *(int *)(local_810.hit + 0xe8);
          iVar86 = *(int *)(local_810.hit + 0xec);
          iVar87 = *(int *)(local_810.hit + 0xf0);
          iVar88 = *(int *)(local_810.hit + 0xf4);
          iVar89 = *(int *)(local_810.hit + 0xf8);
          iVar90 = *(int *)(local_810.hit + 0xfc);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar75 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar75 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar75 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar75 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar75 >> 0xc) & 1);
          bVar31 = (bool)((byte)(uVar75 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar75 >> 0xe) & 1);
          bVar39 = SUB81(uVar75 >> 0xf,0);
          *(uint *)(local_810.ray + 0x3c0) =
               (uint)(bVar100 & 1) * *(int *)(local_810.hit + 0xc0) |
               (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x3c0);
          *(uint *)(local_810.ray + 0x3c4) =
               (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x3c4);
          *(uint *)(local_810.ray + 0x3c8) =
               (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x3c8);
          *(uint *)(local_810.ray + 0x3cc) =
               (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x3cc);
          *(uint *)(local_810.ray + 0x3d0) =
               (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x3d0);
          *(uint *)(local_810.ray + 0x3d4) =
               (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x3d4);
          *(uint *)(local_810.ray + 0x3d8) =
               (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x3d8);
          *(uint *)(local_810.ray + 0x3dc) =
               (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x3dc);
          *(uint *)(local_810.ray + 0x3e0) =
               (uint)(bVar91 & 1) * iVar146 |
               (uint)!(bool)(bVar91 & 1) * *(int *)(local_810.ray + 0x3e0);
          *(uint *)(local_810.ray + 0x3e4) =
               (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x3e4);
          *(uint *)(local_810.ray + 1000) =
               (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 1000);
          *(uint *)(local_810.ray + 0x3ec) =
               (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x3ec);
          *(uint *)(local_810.ray + 0x3f0) =
               (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x3f0);
          *(uint *)(local_810.ray + 0x3f4) =
               (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x3f4);
          *(uint *)(local_810.ray + 0x3f8) =
               (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x3f8);
          *(uint *)(local_810.ray + 0x3fc) =
               (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x3fc);
          iVar103 = *(int *)(local_810.hit + 0x104);
          iVar140 = *(int *)(local_810.hit + 0x108);
          iVar141 = *(int *)(local_810.hit + 0x10c);
          iVar142 = *(int *)(local_810.hit + 0x110);
          iVar143 = *(int *)(local_810.hit + 0x114);
          iVar144 = *(int *)(local_810.hit + 0x118);
          iVar145 = *(int *)(local_810.hit + 0x11c);
          iVar146 = *(int *)(local_810.hit + 0x120);
          iVar84 = *(int *)(local_810.hit + 0x124);
          iVar85 = *(int *)(local_810.hit + 0x128);
          iVar86 = *(int *)(local_810.hit + 300);
          iVar87 = *(int *)(local_810.hit + 0x130);
          iVar88 = *(int *)(local_810.hit + 0x134);
          iVar89 = *(int *)(local_810.hit + 0x138);
          iVar90 = *(int *)(local_810.hit + 0x13c);
          bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar75 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar75 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar75 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar75 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar75 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar75 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar75 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar75 >> 0xc) & 1);
          bVar31 = (bool)((byte)(uVar75 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar75 >> 0xe) & 1);
          bVar39 = SUB81(uVar75 >> 0xf,0);
          *(uint *)(local_810.ray + 0x400) =
               (uint)(bVar100 & 1) * *(int *)(local_810.hit + 0x100) |
               (uint)!(bool)(bVar100 & 1) * *(int *)(local_810.ray + 0x400);
          *(uint *)(local_810.ray + 0x404) =
               (uint)bVar13 * iVar103 | (uint)!bVar13 * *(int *)(local_810.ray + 0x404);
          *(uint *)(local_810.ray + 0x408) =
               (uint)bVar14 * iVar140 | (uint)!bVar14 * *(int *)(local_810.ray + 0x408);
          *(uint *)(local_810.ray + 0x40c) =
               (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_810.ray + 0x40c);
          *(uint *)(local_810.ray + 0x410) =
               (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_810.ray + 0x410);
          *(uint *)(local_810.ray + 0x414) =
               (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_810.ray + 0x414);
          *(uint *)(local_810.ray + 0x418) =
               (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_810.ray + 0x418);
          *(uint *)(local_810.ray + 0x41c) =
               (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_810.ray + 0x41c);
          *(uint *)(local_810.ray + 0x420) =
               (uint)(bVar91 & 1) * iVar146 |
               (uint)!(bool)(bVar91 & 1) * *(int *)(local_810.ray + 0x420);
          *(uint *)(local_810.ray + 0x424) =
               (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_810.ray + 0x424);
          *(uint *)(local_810.ray + 0x428) =
               (uint)bVar21 * iVar85 | (uint)!bVar21 * *(int *)(local_810.ray + 0x428);
          *(uint *)(local_810.ray + 0x42c) =
               (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_810.ray + 0x42c);
          *(uint *)(local_810.ray + 0x430) =
               (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_810.ray + 0x430);
          *(uint *)(local_810.ray + 0x434) =
               (uint)bVar31 * iVar88 | (uint)!bVar31 * *(int *)(local_810.ray + 0x434);
          *(uint *)(local_810.ray + 0x438) =
               (uint)bVar32 * iVar89 | (uint)!bVar32 * *(int *)(local_810.ray + 0x438);
          *(uint *)(local_810.ray + 0x43c) =
               (uint)bVar39 * iVar90 | (uint)!bVar39 * *(int *)(local_810.ray + 0x43c);
          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x140));
          auVar185 = vmovdqu32_avx512f(auVar185);
          *(undefined1 (*) [64])(local_810.ray + 0x440) = auVar185;
          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x180));
          auVar185 = vmovdqu32_avx512f(auVar185);
          *(undefined1 (*) [64])(local_810.ray + 0x480) = auVar185;
          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x1c0));
          auVar185 = vmovdqa32_avx512f(auVar185);
          *(undefined1 (*) [64])(local_810.ray + 0x4c0) = auVar185;
          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_810.hit + 0x200));
          auVar185 = vmovdqa32_avx512f(auVar185);
          *(undefined1 (*) [64])(local_810.ray + 0x500) = auVar185;
          auVar185 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        }
        uVar183 = auVar185._0_4_;
        auVar148._4_4_ = uVar183;
        auVar148._0_4_ = uVar183;
        auVar148._8_4_ = uVar183;
        auVar148._12_4_ = uVar183;
        auVar148._16_4_ = uVar183;
        auVar148._20_4_ = uVar183;
        auVar148._24_4_ = uVar183;
        auVar148._28_4_ = uVar183;
        uVar70 = vcmpps_avx512vl(auVar157._0_32_,auVar148,2);
        uVar98 = (uint)(byte)(~(byte)(1 << (uVar93 & 0x1f)) & (byte)uVar98) & (uint)uVar70;
        uVar101 = uVar102;
      }
      bVar100 = (byte)uVar101;
      auVar109 = auVar167._0_32_;
      auVar160 = auVar191._0_32_;
      auVar118 = auVar180._0_32_;
      auVar116 = auVar199._0_32_;
      auVar113 = auVar198._0_32_;
      auVar110 = auVar169._0_32_;
      auVar112 = auVar197._0_32_;
      auVar108 = auVar161._0_32_;
      auVar117 = auVar200._0_32_;
      auVar120 = auVar202._0_32_;
      auVar158 = auVar190._0_32_;
      auVar129 = auVar189._0_32_;
      auVar121 = auVar203._0_32_;
      auVar119 = auVar201._0_32_;
      auVar111 = auVar196._0_32_;
      auVar107 = auVar195._0_32_;
      auVar105 = auVar194._0_32_;
      auVar162 = auVar192._0_32_;
      auVar114 = auVar187._0_32_;
      auVar115 = auVar188._0_32_;
      auVar136 = auVar186._0_32_;
      bVar91 = (byte)uVar98;
      if (bVar91 == 0) goto LAB_01c5628f;
      auVar108 = vblendmps_avx512vl(auVar193._0_32_,auVar157._0_32_);
      auVar106._0_4_ =
           (uint)(bVar91 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar148._0_4_;
      bVar13 = (bool)((byte)(uVar98 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar148._4_4_;
      bVar13 = (bool)((byte)(uVar98 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar148._8_4_;
      bVar13 = (bool)((byte)(uVar98 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar148._12_4_;
      bVar13 = (bool)((byte)(uVar98 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar148._16_4_;
      bVar13 = (bool)((byte)(uVar98 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar148._20_4_;
      bVar13 = (bool)((byte)(uVar98 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar148._24_4_;
      auVar106._28_4_ =
           (uVar98 >> 7) * auVar108._28_4_ | (uint)!SUB41(uVar98 >> 7,0) * auVar148._28_4_;
      auVar108 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar108 = vminps_avx(auVar106,auVar108);
      auVar109 = vshufpd_avx(auVar108,auVar108,5);
      auVar108 = vminps_avx(auVar108,auVar109);
      auVar109 = vpermpd_avx2(auVar108,0x4e);
      auVar108 = vminps_avx(auVar108,auVar109);
      uVar70 = vcmpps_avx512vl(auVar106,auVar108,0);
      bVar91 = (byte)uVar70 & bVar91;
      uVar94 = uVar98;
      if (bVar91 != 0) {
        uVar94 = (uint)bVar91;
      }
      uVar93 = 0;
      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
        uVar93 = uVar93 + 1;
      }
      goto LAB_01c55c0e;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }